

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_fma::forward
          (Convolution1D_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  _func_int *p_Var6;
  long lVar7;
  float *pfVar8;
  void *pvVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int *piVar19;
  undefined1 auVar20 [16];
  void *pvVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [32];
  uint uVar33;
  long lVar34;
  long lVar35;
  undefined4 *puVar36;
  _func_int ***ppp_Var37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  void *pvVar42;
  void *pvVar43;
  _func_int ***ppp_Var44;
  int iVar45;
  uint uVar46;
  undefined1 (*pauVar47) [32];
  undefined1 (*pauVar48) [16];
  uint uVar49;
  uint uVar50;
  undefined4 *puVar51;
  undefined1 (*pauVar52) [32];
  long lVar53;
  uint uVar54;
  float *pfVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  uint uVar60;
  long lVar61;
  float *pfVar62;
  bool bVar63;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar65;
  float fVar66;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  float sum [4];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [28];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar120;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar122 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  float fVar193;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [64];
  __m128 one;
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [64];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [32];
  int elempack;
  int inh;
  ulong local_1f8;
  long local_1e0;
  long local_1d0;
  undefined1 (*local_1c8) [32];
  ulong local_1b8;
  void *local_1b0;
  ulong local_1a0;
  Allocator *local_198;
  Allocator *local_160;
  ulong local_150;
  ulong local_148;
  uint local_130;
  long local_128;
  undefined1 local_118 [16];
  Mat local_d8;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  long local_38;
  float fVar64;
  undefined1 auVar83 [32];
  float fVar87;
  
  uVar30 = bottom_blob->elemsize;
  iVar3 = bottom_blob->elempack;
  p_Var6 = this->_vptr_Convolution1D_x86_fma[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var6);
  iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var6);
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.h = (int)local_d8.elemsize;
  local_d8.d = (int)local_d8.refcount;
  local_d8.c = local_d8.elempack;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86_fma + (long)this->_vptr_Convolution1D_x86_fma[-3]
             ),bottom_blob,&local_d8,opt);
  iVar45 = -100;
  if (((Allocator *)local_d8.data != (Allocator *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
  {
    lVar27 = 1;
    if (opt->use_packing_layout == true) {
      lVar27 = 8;
      if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]) & 7) != 0) {
        lVar27 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3])
                         & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_d8.w + ~((iVar4 + -1) * iVar5)) /
                         *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86_fma[-3]) +
                         1,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_fma[-3]) /
                (int)lVar27,lVar27 * (uVar30 / (ulong)(long)iVar3),(int)lVar27,opt->blob_allocator);
    iVar3 = local_d8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      p_Var6 = this->_vptr_Convolution1D_x86_fma[-3];
      iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var6);
      uVar33 = *(uint *)(&this->field_0xf4 + (long)p_Var6);
      local_80 = (ulong)uVar33;
      iVar5 = *(int *)(&this->field_0xd8 + (long)p_Var6);
      lVar27 = (long)iVar5;
      iVar45 = *(int *)(&this->field_0xdc + (long)p_Var6);
      lVar28 = (long)iVar45;
      uVar22 = local_d8.h * local_d8.elempack;
      iVar23 = local_d8.w * local_d8.elempack;
      local_60 = (long)top_blob->w;
      local_88 = (long)top_blob->h * (long)top_blob->elempack;
      lVar57 = top_blob->elempack * local_60;
      iVar25 = (int)local_88;
      iVar26 = iVar25 + 7;
      if (-1 < iVar25) {
        iVar26 = iVar25;
      }
      lVar7 = *(long *)(&this->field_0x190 + (long)p_Var6);
      uVar49 = iVar26 >> 3;
      lVar59 = (long)iVar23;
      iVar26 = (int)lVar57;
      if (7 < iVar25) {
        local_90 = (ulong)(iVar26 * 7);
        auVar207 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar204 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar210 = ZEXT1664(ZEXT816(0) << 0x40);
        local_78 = lVar59 * 4;
        local_1f8 = 0;
        auVar307._8_4_ = 0x3f318000;
        auVar307._0_8_ = 0x3f3180003f318000;
        auVar307._12_4_ = 0x3f318000;
        auVar307._16_4_ = 0x3f318000;
        auVar307._20_4_ = 0x3f318000;
        auVar307._24_4_ = 0x3f318000;
        auVar307._28_4_ = 0x3f318000;
        do {
          lVar29 = (long)top_blob->w;
          if (0 < lVar29) {
            uVar60 = local_d8.h * local_d8.elempack;
            iVar56 = top_blob->elempack;
            local_1c8 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1f8 * 8) >> 0x1f) << 0x20 |
                                     local_1f8 * 8 & 0xffffffff) / (long)iVar56) * lVar29 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1d0 = 0;
            iVar40 = 0;
            local_1e0 = 0;
            local_198 = (Allocator *)local_78;
            do {
              auVar302 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar86 = ZEXT1664(ZEXT816(0) << 0x40);
              if (lVar7 != 0) {
                auVar86 = ZEXT3264(*(undefined1 (*) [32])(lVar7 + local_1f8 * 0x20));
              }
              pauVar47 = (undefined1 (*) [32])
                         ((this->weight_data_tm).cstep * local_1f8 * (this->weight_data_tm).elemsize
                         + (long)(this->weight_data_tm).data);
              local_118._0_4_ = iVar40;
              if ((int)uVar60 < 8) {
                auVar158 = ZEXT864(0);
                auVar119 = ZEXT864(0);
                uVar46 = 0;
              }
              else {
                auVar119 = ZEXT864(0);
                auVar158 = ZEXT864(0);
                iVar39 = 0;
                do {
                  lVar34 = (long)(iVar39 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar51 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar34 + (long)(iVar45 * local_d8.elempack * (int)local_1e0) * 4);
                  if ((local_d8.elempack == 8) && (0 < iVar4)) {
                    puVar51 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar34 + (long)iVar40 * 4);
                    iVar38 = iVar4;
                    do {
                      uVar2 = *puVar51;
                      auVar82._4_4_ = uVar2;
                      auVar82._0_4_ = uVar2;
                      auVar82._8_4_ = uVar2;
                      auVar82._12_4_ = uVar2;
                      auVar82._16_4_ = uVar2;
                      auVar82._20_4_ = uVar2;
                      auVar82._24_4_ = uVar2;
                      auVar82._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar82,auVar86._0_32_,*pauVar47);
                      uVar2 = puVar51[1];
                      auVar252._4_4_ = uVar2;
                      auVar252._0_4_ = uVar2;
                      auVar252._8_4_ = uVar2;
                      auVar252._12_4_ = uVar2;
                      auVar252._16_4_ = uVar2;
                      auVar252._20_4_ = uVar2;
                      auVar252._24_4_ = uVar2;
                      auVar252._28_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar252,auVar119._0_32_,pauVar47[1]);
                      uVar2 = puVar51[2];
                      auVar263._4_4_ = uVar2;
                      auVar263._0_4_ = uVar2;
                      auVar263._8_4_ = uVar2;
                      auVar263._12_4_ = uVar2;
                      auVar263._16_4_ = uVar2;
                      auVar263._20_4_ = uVar2;
                      auVar263._24_4_ = uVar2;
                      auVar263._28_4_ = uVar2;
                      auVar203 = vfmadd132ps_fma(auVar263,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar51[3];
                      auVar282._4_4_ = uVar2;
                      auVar282._0_4_ = uVar2;
                      auVar282._8_4_ = uVar2;
                      auVar282._12_4_ = uVar2;
                      auVar282._16_4_ = uVar2;
                      auVar282._20_4_ = uVar2;
                      auVar282._24_4_ = uVar2;
                      auVar282._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar282,auVar302._0_32_,pauVar47[3]);
                      uVar2 = puVar51[4];
                      auVar77._4_4_ = uVar2;
                      auVar77._0_4_ = uVar2;
                      auVar77._8_4_ = uVar2;
                      auVar77._12_4_ = uVar2;
                      auVar77._16_4_ = uVar2;
                      auVar77._20_4_ = uVar2;
                      auVar77._24_4_ = uVar2;
                      auVar77._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar77,ZEXT1632(auVar88),pauVar47[4]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[5];
                      auVar106._4_4_ = uVar2;
                      auVar106._0_4_ = uVar2;
                      auVar106._8_4_ = uVar2;
                      auVar106._12_4_ = uVar2;
                      auVar106._16_4_ = uVar2;
                      auVar106._20_4_ = uVar2;
                      auVar106._24_4_ = uVar2;
                      auVar106._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar106,ZEXT1632(auVar121),pauVar47[5]);
                      auVar119 = ZEXT1664(auVar88);
                      uVar2 = puVar51[6];
                      auVar142._4_4_ = uVar2;
                      auVar142._0_4_ = uVar2;
                      auVar142._8_4_ = uVar2;
                      auVar142._12_4_ = uVar2;
                      auVar142._16_4_ = uVar2;
                      auVar142._20_4_ = uVar2;
                      auVar142._24_4_ = uVar2;
                      auVar142._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar142,ZEXT1632(auVar203),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar88);
                      uVar2 = puVar51[7];
                      auVar298._4_4_ = uVar2;
                      auVar298._0_4_ = uVar2;
                      auVar298._8_4_ = uVar2;
                      auVar298._12_4_ = uVar2;
                      auVar298._16_4_ = uVar2;
                      auVar298._20_4_ = uVar2;
                      auVar298._24_4_ = uVar2;
                      auVar298._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar298,ZEXT1632(auVar160),pauVar47[7]);
                      auVar302 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 8;
                      puVar51 = puVar51 + iVar5 * 8;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar222._4_4_ = uVar2;
                      auVar222._0_4_ = uVar2;
                      auVar222._8_4_ = uVar2;
                      auVar222._12_4_ = uVar2;
                      auVar222._16_4_ = uVar2;
                      auVar222._20_4_ = uVar2;
                      auVar222._24_4_ = uVar2;
                      auVar222._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar222,auVar86._0_32_,*pauVar47);
                      uVar2 = puVar51[1];
                      auVar253._4_4_ = uVar2;
                      auVar253._0_4_ = uVar2;
                      auVar253._8_4_ = uVar2;
                      auVar253._12_4_ = uVar2;
                      auVar253._16_4_ = uVar2;
                      auVar253._20_4_ = uVar2;
                      auVar253._24_4_ = uVar2;
                      auVar253._28_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar253,auVar119._0_32_,pauVar47[1]);
                      uVar2 = puVar51[2];
                      auVar264._4_4_ = uVar2;
                      auVar264._0_4_ = uVar2;
                      auVar264._8_4_ = uVar2;
                      auVar264._12_4_ = uVar2;
                      auVar264._16_4_ = uVar2;
                      auVar264._20_4_ = uVar2;
                      auVar264._24_4_ = uVar2;
                      auVar264._28_4_ = uVar2;
                      auVar203 = vfmadd132ps_fma(auVar264,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar51[3];
                      auVar283._4_4_ = uVar2;
                      auVar283._0_4_ = uVar2;
                      auVar283._8_4_ = uVar2;
                      auVar283._12_4_ = uVar2;
                      auVar283._16_4_ = uVar2;
                      auVar283._20_4_ = uVar2;
                      auVar283._24_4_ = uVar2;
                      auVar283._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar283,auVar302._0_32_,pauVar47[3]);
                      uVar2 = puVar51[lVar59];
                      auVar78._4_4_ = uVar2;
                      auVar78._0_4_ = uVar2;
                      auVar78._8_4_ = uVar2;
                      auVar78._12_4_ = uVar2;
                      auVar78._16_4_ = uVar2;
                      auVar78._20_4_ = uVar2;
                      auVar78._24_4_ = uVar2;
                      auVar78._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar78,ZEXT1632(auVar88),pauVar47[4]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 1];
                      auVar107._4_4_ = uVar2;
                      auVar107._0_4_ = uVar2;
                      auVar107._8_4_ = uVar2;
                      auVar107._12_4_ = uVar2;
                      auVar107._16_4_ = uVar2;
                      auVar107._20_4_ = uVar2;
                      auVar107._24_4_ = uVar2;
                      auVar107._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar107,ZEXT1632(auVar121),pauVar47[5]);
                      auVar119 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 2];
                      auVar143._4_4_ = uVar2;
                      auVar143._0_4_ = uVar2;
                      auVar143._8_4_ = uVar2;
                      auVar143._12_4_ = uVar2;
                      auVar143._16_4_ = uVar2;
                      auVar143._20_4_ = uVar2;
                      auVar143._24_4_ = uVar2;
                      auVar143._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar143,ZEXT1632(auVar203),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 3];
                      auVar299._4_4_ = uVar2;
                      auVar299._0_4_ = uVar2;
                      auVar299._8_4_ = uVar2;
                      auVar299._12_4_ = uVar2;
                      auVar299._16_4_ = uVar2;
                      auVar299._20_4_ = uVar2;
                      auVar299._24_4_ = uVar2;
                      auVar299._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar299,ZEXT1632(auVar160),pauVar47[7]);
                      auVar302 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 8;
                      puVar51 = puVar51 + iVar5 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar223._4_4_ = uVar2;
                      auVar223._0_4_ = uVar2;
                      auVar223._8_4_ = uVar2;
                      auVar223._12_4_ = uVar2;
                      auVar223._16_4_ = uVar2;
                      auVar223._20_4_ = uVar2;
                      auVar223._24_4_ = uVar2;
                      auVar223._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar223,auVar86._0_32_,*pauVar47);
                      uVar2 = puVar51[lVar59];
                      auVar254._4_4_ = uVar2;
                      auVar254._0_4_ = uVar2;
                      auVar254._8_4_ = uVar2;
                      auVar254._12_4_ = uVar2;
                      auVar254._16_4_ = uVar2;
                      auVar254._20_4_ = uVar2;
                      auVar254._24_4_ = uVar2;
                      auVar254._28_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar254,auVar119._0_32_,pauVar47[1]);
                      uVar2 = puVar51[iVar23 * 2];
                      auVar265._4_4_ = uVar2;
                      auVar265._0_4_ = uVar2;
                      auVar265._8_4_ = uVar2;
                      auVar265._12_4_ = uVar2;
                      auVar265._16_4_ = uVar2;
                      auVar265._20_4_ = uVar2;
                      auVar265._24_4_ = uVar2;
                      auVar265._28_4_ = uVar2;
                      auVar203 = vfmadd132ps_fma(auVar265,auVar158._0_32_,pauVar47[2]);
                      uVar2 = puVar51[iVar23 * 3];
                      auVar284._4_4_ = uVar2;
                      auVar284._0_4_ = uVar2;
                      auVar284._8_4_ = uVar2;
                      auVar284._12_4_ = uVar2;
                      auVar284._16_4_ = uVar2;
                      auVar284._20_4_ = uVar2;
                      auVar284._24_4_ = uVar2;
                      auVar284._28_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar284,auVar302._0_32_,pauVar47[3]);
                      uVar2 = puVar51[iVar23 * 4];
                      auVar79._4_4_ = uVar2;
                      auVar79._0_4_ = uVar2;
                      auVar79._8_4_ = uVar2;
                      auVar79._12_4_ = uVar2;
                      auVar79._16_4_ = uVar2;
                      auVar79._20_4_ = uVar2;
                      auVar79._24_4_ = uVar2;
                      auVar79._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar79,ZEXT1632(auVar88),pauVar47[4]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 5];
                      auVar108._4_4_ = uVar2;
                      auVar108._0_4_ = uVar2;
                      auVar108._8_4_ = uVar2;
                      auVar108._12_4_ = uVar2;
                      auVar108._16_4_ = uVar2;
                      auVar108._20_4_ = uVar2;
                      auVar108._24_4_ = uVar2;
                      auVar108._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar108,ZEXT1632(auVar121),pauVar47[5]);
                      auVar119 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 6];
                      auVar144._4_4_ = uVar2;
                      auVar144._0_4_ = uVar2;
                      auVar144._8_4_ = uVar2;
                      auVar144._12_4_ = uVar2;
                      auVar144._16_4_ = uVar2;
                      auVar144._20_4_ = uVar2;
                      auVar144._24_4_ = uVar2;
                      auVar144._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar144,ZEXT1632(auVar203),pauVar47[6]);
                      auVar158 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 7];
                      auVar300._4_4_ = uVar2;
                      auVar300._0_4_ = uVar2;
                      auVar300._8_4_ = uVar2;
                      auVar300._12_4_ = uVar2;
                      auVar300._16_4_ = uVar2;
                      auVar300._20_4_ = uVar2;
                      auVar300._24_4_ = uVar2;
                      auVar300._28_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar300,ZEXT1632(auVar160),pauVar47[7]);
                      auVar302 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 8;
                      puVar51 = puVar51 + lVar27;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                  uVar46 = uVar60 & 0xfffffff8;
                } while (iVar38 < (int)uVar60);
              }
              auVar106 = auVar302._0_32_;
              auVar77 = auVar158._0_32_;
              if ((int)(uVar46 | 3) < (int)uVar60) {
                uVar54 = uVar46;
                do {
                  lVar34 = (long)((int)uVar54 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar51 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar34 + (long)(iVar45 * local_d8.elempack * (int)local_1e0) * 4);
                  if ((local_d8.elempack == 4) && (0 < iVar4)) {
                    puVar51 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar34 + (long)iVar40 * 4);
                    iVar39 = iVar4;
                    do {
                      uVar2 = *puVar51;
                      auVar224._4_4_ = uVar2;
                      auVar224._0_4_ = uVar2;
                      auVar224._8_4_ = uVar2;
                      auVar224._12_4_ = uVar2;
                      auVar224._16_4_ = uVar2;
                      auVar224._20_4_ = uVar2;
                      auVar224._24_4_ = uVar2;
                      auVar224._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_32_,auVar224,*pauVar47);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[1];
                      auVar225._4_4_ = uVar2;
                      auVar225._0_4_ = uVar2;
                      auVar225._8_4_ = uVar2;
                      auVar225._12_4_ = uVar2;
                      auVar225._16_4_ = uVar2;
                      auVar225._20_4_ = uVar2;
                      auVar225._24_4_ = uVar2;
                      auVar225._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar119._0_32_,auVar225,pauVar47[1]);
                      auVar119 = ZEXT1664(auVar88);
                      uVar2 = puVar51[2];
                      auVar226._4_4_ = uVar2;
                      auVar226._0_4_ = uVar2;
                      auVar226._8_4_ = uVar2;
                      auVar226._12_4_ = uVar2;
                      auVar226._16_4_ = uVar2;
                      auVar226._20_4_ = uVar2;
                      auVar226._24_4_ = uVar2;
                      auVar226._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar158._0_32_,auVar226,pauVar47[2]);
                      auVar158 = ZEXT1664(auVar88);
                      uVar2 = puVar51[3];
                      auVar227._4_4_ = uVar2;
                      auVar227._0_4_ = uVar2;
                      auVar227._8_4_ = uVar2;
                      auVar227._12_4_ = uVar2;
                      auVar227._16_4_ = uVar2;
                      auVar227._20_4_ = uVar2;
                      auVar227._24_4_ = uVar2;
                      auVar227._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar302._0_32_,auVar227,pauVar47[3]);
                      auVar302 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 4;
                      puVar51 = puVar51 + iVar5 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar39 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar228._4_4_ = uVar2;
                      auVar228._0_4_ = uVar2;
                      auVar228._8_4_ = uVar2;
                      auVar228._12_4_ = uVar2;
                      auVar228._16_4_ = uVar2;
                      auVar228._20_4_ = uVar2;
                      auVar228._24_4_ = uVar2;
                      auVar228._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_32_,auVar228,*pauVar47);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59];
                      auVar229._4_4_ = uVar2;
                      auVar229._0_4_ = uVar2;
                      auVar229._8_4_ = uVar2;
                      auVar229._12_4_ = uVar2;
                      auVar229._16_4_ = uVar2;
                      auVar229._20_4_ = uVar2;
                      auVar229._24_4_ = uVar2;
                      auVar229._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar119._0_32_,auVar229,pauVar47[1]);
                      auVar119 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 2];
                      auVar230._4_4_ = uVar2;
                      auVar230._0_4_ = uVar2;
                      auVar230._8_4_ = uVar2;
                      auVar230._12_4_ = uVar2;
                      auVar230._16_4_ = uVar2;
                      auVar230._20_4_ = uVar2;
                      auVar230._24_4_ = uVar2;
                      auVar230._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar158._0_32_,auVar230,pauVar47[2]);
                      auVar158 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 3];
                      auVar231._4_4_ = uVar2;
                      auVar231._0_4_ = uVar2;
                      auVar231._8_4_ = uVar2;
                      auVar231._12_4_ = uVar2;
                      auVar231._16_4_ = uVar2;
                      auVar231._20_4_ = uVar2;
                      auVar231._24_4_ = uVar2;
                      auVar231._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar302._0_32_,auVar231,pauVar47[3]);
                      auVar302 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 4;
                      puVar51 = puVar51 + lVar27;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar106 = auVar302._0_32_;
                  auVar77 = auVar158._0_32_;
                  uVar46 = uVar54 + 4;
                  iVar39 = uVar54 + 7;
                  uVar54 = uVar46;
                } while (iVar39 < (int)uVar60);
              }
              auVar142 = auVar119._0_32_;
              uVar30 = (ulong)uVar46;
              if ((int)(uVar46 | 1) < (int)uVar60) {
                lVar34 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar35 = lVar34 * uVar30;
                lVar61 = (long)(_func_int ***)local_d8.data + lVar35 + (long)local_198;
                lVar34 = lVar34 * 2;
                lVar35 = (long)(_func_int ***)local_d8.data + lVar35 + local_1d0;
                do {
                  if (0 < iVar4) {
                    lVar58 = 0;
                    iVar39 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)(lVar35 + lVar58);
                      auVar232._4_4_ = uVar2;
                      auVar232._0_4_ = uVar2;
                      auVar232._8_4_ = uVar2;
                      auVar232._12_4_ = uVar2;
                      auVar232._16_4_ = uVar2;
                      auVar232._20_4_ = uVar2;
                      auVar232._24_4_ = uVar2;
                      auVar232._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_32_,auVar232,*pauVar47);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = *(undefined4 *)(lVar61 + lVar58);
                      auVar233._4_4_ = uVar2;
                      auVar233._0_4_ = uVar2;
                      auVar233._8_4_ = uVar2;
                      auVar233._12_4_ = uVar2;
                      auVar233._16_4_ = uVar2;
                      auVar233._20_4_ = uVar2;
                      auVar233._24_4_ = uVar2;
                      auVar233._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar119._0_32_,auVar233,pauVar47[1]);
                      auVar119 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 2;
                      lVar58 = lVar58 + lVar27 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar142 = auVar119._0_32_;
                  uVar30 = uVar30 + 2;
                  uVar46 = (uint)uVar30;
                  lVar61 = lVar61 + lVar34;
                  lVar35 = lVar35 + lVar34;
                } while ((int)(uVar46 | 1) < (int)uVar60);
              }
              auVar82 = auVar86._0_32_;
              if ((int)uVar46 < (int)uVar60) {
                lVar34 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar30 = (ulong)uVar46;
                puVar51 = (undefined4 *)
                          ((long)(_func_int ***)local_d8.data + lVar34 * uVar30 + local_1d0);
                do {
                  puVar36 = puVar51;
                  iVar39 = iVar4;
                  if (0 < iVar4) {
                    do {
                      uVar2 = *puVar36;
                      auVar234._4_4_ = uVar2;
                      auVar234._0_4_ = uVar2;
                      auVar234._8_4_ = uVar2;
                      auVar234._12_4_ = uVar2;
                      auVar234._16_4_ = uVar2;
                      auVar234._20_4_ = uVar2;
                      auVar234._24_4_ = uVar2;
                      auVar234._28_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_32_,auVar234,*pauVar47);
                      auVar86 = ZEXT1664(auVar88);
                      pauVar47 = pauVar47 + 1;
                      puVar36 = puVar36 + lVar27;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar82 = auVar86._0_32_;
                  uVar30 = uVar30 + 1;
                  puVar51 = (undefined4 *)((long)puVar51 + lVar34);
                } while ((int)uVar30 < (int)uVar60);
              }
              fVar64 = auVar106._0_4_ + auVar77._0_4_ + auVar142._0_4_ + auVar82._0_4_;
              fVar87 = auVar106._4_4_ + auVar77._4_4_ + auVar142._4_4_ + auVar82._4_4_;
              auVar80._0_8_ = CONCAT44(fVar87,fVar64);
              auVar80._8_4_ = auVar106._8_4_ + auVar77._8_4_ + auVar142._8_4_ + auVar82._8_4_;
              auVar80._12_4_ = auVar106._12_4_ + auVar77._12_4_ + auVar142._12_4_ + auVar82._12_4_;
              auVar80._16_4_ = auVar106._16_4_ + auVar77._16_4_ + auVar142._16_4_ + auVar82._16_4_;
              auVar80._20_4_ = auVar106._20_4_ + auVar77._20_4_ + auVar142._20_4_ + auVar82._20_4_;
              auVar80._24_4_ = auVar106._24_4_ + auVar77._24_4_ + auVar142._24_4_ + auVar82._24_4_;
              auVar80._28_4_ = auVar106._28_4_ + auVar77._28_4_ + auVar142._28_4_ + auVar82._28_4_;
              auVar142 = auVar210._0_32_;
              auVar77 = auVar204._0_32_;
              auVar106 = auVar207._0_32_;
              fVar65 = auVar204._0_4_;
              fVar66 = auVar204._4_4_;
              fVar193 = auVar204._8_4_;
              fVar120 = auVar204._12_4_;
              fVar159 = auVar204._16_4_;
              fVar13 = auVar204._20_4_;
              fVar14 = auVar204._24_4_;
              fVar15 = auVar204._28_4_;
              switch(uVar33) {
              case 1:
                auVar80 = vmaxps_avx(auVar80,auVar142);
                break;
              case 2:
                auVar77 = vmaxps_avx(auVar80,auVar142);
                auVar106 = vminps_avx(auVar80,auVar142);
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar85._4_4_ = uVar2;
                auVar85._0_4_ = uVar2;
                auVar85._8_4_ = uVar2;
                auVar85._12_4_ = uVar2;
                auVar85._16_4_ = uVar2;
                auVar85._20_4_ = uVar2;
                auVar85._24_4_ = uVar2;
                auVar85._28_4_ = uVar2;
                auVar88 = vfmadd213ps_fma(auVar85,auVar106,auVar77);
                auVar80 = ZEXT1632(auVar88);
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar113._4_4_ = uVar2;
                auVar113._0_4_ = uVar2;
                auVar113._8_4_ = uVar2;
                auVar113._12_4_ = uVar2;
                auVar113._16_4_ = uVar2;
                auVar113._20_4_ = uVar2;
                auVar113._24_4_ = uVar2;
                auVar113._28_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar152._4_4_ = uVar2;
                auVar152._0_4_ = uVar2;
                auVar152._8_4_ = uVar2;
                auVar152._12_4_ = uVar2;
                auVar152._16_4_ = uVar2;
                auVar152._20_4_ = uVar2;
                auVar152._24_4_ = uVar2;
                auVar152._28_4_ = uVar2;
                auVar77 = vmaxps_avx(auVar80,auVar113);
                auVar80 = vminps_avx(auVar77,auVar152);
                break;
              case 4:
                auVar81._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                auVar81._8_4_ = -auVar80._8_4_;
                auVar81._12_4_ = -auVar80._12_4_;
                auVar81._16_4_ = -auVar80._16_4_;
                auVar81._20_4_ = -auVar80._20_4_;
                auVar81._24_4_ = -auVar80._24_4_;
                auVar81._28_4_ = -auVar80._28_4_;
                auVar114._8_4_ = 0x42b0c0a5;
                auVar114._0_8_ = 0x42b0c0a542b0c0a5;
                auVar114._12_4_ = 0x42b0c0a5;
                auVar114._16_4_ = 0x42b0c0a5;
                auVar114._20_4_ = 0x42b0c0a5;
                auVar114._24_4_ = 0x42b0c0a5;
                auVar114._28_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar81,auVar114);
                auVar115._8_4_ = 0xc2b0c0a5;
                auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar115._12_4_ = 0xc2b0c0a5;
                auVar115._16_4_ = 0xc2b0c0a5;
                auVar115._20_4_ = 0xc2b0c0a5;
                auVar115._24_4_ = 0xc2b0c0a5;
                auVar115._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar142,auVar115);
                auVar116._8_4_ = 0x3fb8aa3b;
                auVar116._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar116._12_4_ = 0x3fb8aa3b;
                auVar116._16_4_ = 0x3fb8aa3b;
                auVar116._20_4_ = 0x3fb8aa3b;
                auVar116._24_4_ = 0x3fb8aa3b;
                auVar116._28_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar116,auVar82,auVar106);
                auVar252 = vroundps_avx(ZEXT1632(auVar88),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar88),auVar252,1);
                auVar142 = vandps_avx(auVar142,auVar77);
                auVar142 = vsubps_avx(auVar252,auVar142);
                auVar153._8_4_ = 0x3f318000;
                auVar153._0_8_ = 0x3f3180003f318000;
                auVar153._12_4_ = 0x3f318000;
                auVar153._16_4_ = 0x3f318000;
                auVar153._20_4_ = 0x3f318000;
                auVar153._24_4_ = 0x3f318000;
                auVar153._28_4_ = 0x3f318000;
                auVar88 = vfmsub231ps_fma(auVar82,auVar142,auVar153);
                auVar154._8_4_ = 0x395e8083;
                auVar154._0_8_ = 0x395e8083395e8083;
                auVar154._12_4_ = 0x395e8083;
                auVar154._16_4_ = 0x395e8083;
                auVar154._20_4_ = 0x395e8083;
                auVar154._24_4_ = 0x395e8083;
                auVar154._28_4_ = 0x395e8083;
                auVar121 = vfmsub231ps_fma(ZEXT1632(auVar88),auVar142,auVar154);
                auVar82 = ZEXT1632(auVar121);
                auVar18._28_4_ = 0x395e8083;
                auVar18._0_28_ =
                     ZEXT1628(CONCAT412(auVar121._12_4_ * auVar121._12_4_,
                                        CONCAT48(auVar121._8_4_ * auVar121._8_4_,
                                                 CONCAT44(auVar121._4_4_ * auVar121._4_4_,
                                                          auVar121._0_4_ * auVar121._0_4_))));
                auVar238._8_4_ = 0x39506967;
                auVar238._0_8_ = 0x3950696739506967;
                auVar238._12_4_ = 0x39506967;
                auVar238._16_4_ = 0x39506967;
                auVar238._20_4_ = 0x39506967;
                auVar238._24_4_ = 0x39506967;
                auVar238._28_4_ = 0x39506967;
                auVar201._8_4_ = 0x3ab743ce;
                auVar201._0_8_ = 0x3ab743ce3ab743ce;
                auVar201._12_4_ = 0x3ab743ce;
                auVar201._16_4_ = 0x3ab743ce;
                auVar201._20_4_ = 0x3ab743ce;
                auVar201._24_4_ = 0x3ab743ce;
                auVar201._28_4_ = 0x3ab743ce;
                auVar88 = vfmadd213ps_fma(auVar238,auVar82,auVar201);
                auVar202._8_4_ = 0x3c088908;
                auVar202._0_8_ = 0x3c0889083c088908;
                auVar202._12_4_ = 0x3c088908;
                auVar202._16_4_ = 0x3c088908;
                auVar202._20_4_ = 0x3c088908;
                auVar202._24_4_ = 0x3c088908;
                auVar202._28_4_ = 0x3c088908;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar202);
                auVar189._8_4_ = 0x3d2aa9c1;
                auVar189._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar189._12_4_ = 0x3d2aa9c1;
                auVar189._16_4_ = 0x3d2aa9c1;
                auVar189._20_4_ = 0x3d2aa9c1;
                auVar189._24_4_ = 0x3d2aa9c1;
                auVar189._28_4_ = 0x3d2aa9c1;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar189);
                auVar190._8_4_ = 0x3e2aaaaa;
                auVar190._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar190._12_4_ = 0x3e2aaaaa;
                auVar190._16_4_ = 0x3e2aaaaa;
                auVar190._20_4_ = 0x3e2aaaaa;
                auVar190._24_4_ = 0x3e2aaaaa;
                auVar190._28_4_ = 0x3e2aaaaa;
                auVar82 = ZEXT1632(auVar121);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar190);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar106);
                auVar203 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar18,auVar82);
                auVar67._0_4_ = (int)auVar142._0_4_;
                auVar67._4_4_ = (int)auVar142._4_4_;
                auVar67._8_4_ = (int)auVar142._8_4_;
                auVar67._12_4_ = (int)auVar142._12_4_;
                auVar83._16_4_ = (int)auVar142._16_4_;
                auVar83._0_16_ = auVar67;
                auVar83._20_4_ = (int)auVar142._20_4_;
                auVar83._24_4_ = (int)auVar142._24_4_;
                auVar83._28_4_ = (int)auVar142._28_4_;
                auVar121 = vpslld_avx(auVar67,0x17);
                auVar88 = vpslld_avx(auVar83._16_16_,0x17);
                auVar122._8_4_ = 0x3f800000;
                auVar122._0_8_ = 0x3f8000003f800000;
                auVar122._12_4_ = 0x3f800000;
                auVar88 = vpaddd_avx(auVar88,auVar122);
                auVar121 = vpaddd_avx(auVar121,auVar122);
                auVar84._16_16_ = auVar88;
                auVar84._0_16_ = auVar121;
                auVar117._0_4_ = auVar203._0_4_ + fVar65;
                auVar117._4_4_ = auVar203._4_4_ + fVar66;
                auVar117._8_4_ = auVar203._8_4_ + fVar193;
                auVar117._12_4_ = auVar203._12_4_ + fVar120;
                auVar117._16_4_ = fVar159 + 0.0;
                auVar117._20_4_ = fVar13 + 0.0;
                auVar117._24_4_ = fVar14 + 0.0;
                auVar117._28_4_ = fVar15 + 0.0;
                auVar88 = vfmadd213ps_fma(auVar84,auVar117,auVar77);
                auVar106 = vrcpps_avx(ZEXT1632(auVar88));
                auVar88 = vfmsub213ps_fma(ZEXT1632(auVar88),auVar106,auVar77);
                auVar88 = vfnmadd132ps_fma(ZEXT1632(auVar88),auVar106,auVar106);
                auVar80 = ZEXT1632(auVar88);
                break;
              case 5:
                auVar301._8_4_ = 0x42b0c0a5;
                auVar301._0_8_ = 0x42b0c0a542b0c0a5;
                auVar301._12_4_ = 0x42b0c0a5;
                auVar301._16_4_ = 0x42b0c0a5;
                auVar301._20_4_ = 0x42b0c0a5;
                auVar301._24_4_ = 0x42b0c0a5;
                auVar301._28_4_ = 0x42b0c0a5;
                auVar142 = vminps_avx(auVar301,auVar80);
                auVar295._8_4_ = 0xc2b0c0a5;
                auVar295._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar295._12_4_ = 0xc2b0c0a5;
                auVar295._16_4_ = 0xc2b0c0a5;
                auVar295._20_4_ = 0xc2b0c0a5;
                auVar295._24_4_ = 0xc2b0c0a5;
                auVar295._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar295,auVar142);
                auVar145._8_4_ = 0x3fb8aa3b;
                auVar145._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar145._12_4_ = 0x3fb8aa3b;
                auVar145._16_4_ = 0x3fb8aa3b;
                auVar145._20_4_ = 0x3fb8aa3b;
                auVar145._24_4_ = 0x3fb8aa3b;
                auVar145._28_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar145,auVar82,auVar106);
                auVar252 = vroundps_avx(ZEXT1632(auVar88),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar88),auVar252,1);
                auVar142 = vandps_avx(auVar142,auVar77);
                auVar142 = vsubps_avx(auVar252,auVar142);
                auVar88 = vfmsub231ps_fma(auVar82,auVar142,auVar307);
                auVar296._8_4_ = 0xb95e8083;
                auVar296._0_8_ = 0xb95e8083b95e8083;
                auVar296._12_4_ = 0xb95e8083;
                auVar296._16_4_ = 0xb95e8083;
                auVar296._20_4_ = 0xb95e8083;
                auVar296._24_4_ = 0xb95e8083;
                auVar296._28_4_ = 0xb95e8083;
                auVar121 = vfnmsub231ps_fma(ZEXT1632(auVar88),auVar142,auVar296);
                auVar82 = ZEXT1632(auVar121);
                auVar16._28_4_ = auVar252._28_4_;
                auVar16._0_28_ =
                     ZEXT1628(CONCAT412(auVar121._12_4_ * auVar121._12_4_,
                                        CONCAT48(auVar121._8_4_ * auVar121._8_4_,
                                                 CONCAT44(auVar121._4_4_ * auVar121._4_4_,
                                                          auVar121._0_4_ * auVar121._0_4_))));
                auVar255._8_4_ = 0x39506967;
                auVar255._0_8_ = 0x3950696739506967;
                auVar255._12_4_ = 0x39506967;
                auVar255._16_4_ = 0x39506967;
                auVar255._20_4_ = 0x39506967;
                auVar255._24_4_ = 0x39506967;
                auVar255._28_4_ = 0x39506967;
                auVar199._8_4_ = 0x3ab743ce;
                auVar199._0_8_ = 0x3ab743ce3ab743ce;
                auVar199._12_4_ = 0x3ab743ce;
                auVar199._16_4_ = 0x3ab743ce;
                auVar199._20_4_ = 0x3ab743ce;
                auVar199._24_4_ = 0x3ab743ce;
                auVar199._28_4_ = 0x3ab743ce;
                auVar88 = vfmadd213ps_fma(auVar255,auVar82,auVar199);
                auVar209._8_4_ = 0x3c088908;
                auVar209._0_8_ = 0x3c0889083c088908;
                auVar209._12_4_ = 0x3c088908;
                auVar209._16_4_ = 0x3c088908;
                auVar209._20_4_ = 0x3c088908;
                auVar209._24_4_ = 0x3c088908;
                auVar209._28_4_ = 0x3c088908;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar209);
                auVar188._8_4_ = 0x3d2aa9c1;
                auVar188._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar188._12_4_ = 0x3d2aa9c1;
                auVar188._16_4_ = 0x3d2aa9c1;
                auVar188._20_4_ = 0x3d2aa9c1;
                auVar188._24_4_ = 0x3d2aa9c1;
                auVar188._28_4_ = 0x3d2aa9c1;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar188);
                auVar206._8_4_ = 0x3e2aaaaa;
                auVar206._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar206._12_4_ = 0x3e2aaaaa;
                auVar206._16_4_ = 0x3e2aaaaa;
                auVar206._20_4_ = 0x3e2aaaaa;
                auVar206._24_4_ = 0x3e2aaaaa;
                auVar206._28_4_ = 0x3e2aaaaa;
                auVar82 = ZEXT1632(auVar121);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar206);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar106);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar16,auVar82);
                auVar235._0_4_ = auVar88._0_4_ + fVar65;
                auVar235._4_4_ = auVar88._4_4_ + fVar66;
                auVar235._8_4_ = auVar88._8_4_ + fVar193;
                auVar235._12_4_ = auVar88._12_4_ + fVar120;
                auVar235._16_4_ = fVar159 + 0.0;
                auVar235._20_4_ = fVar13 + 0.0;
                auVar235._24_4_ = fVar14 + 0.0;
                auVar235._28_4_ = fVar15 + 0.0;
                auVar88._0_4_ = (int)auVar142._0_4_;
                auVar88._4_4_ = (int)auVar142._4_4_;
                auVar88._8_4_ = (int)auVar142._8_4_;
                auVar88._12_4_ = (int)auVar142._12_4_;
                auVar109._16_4_ = (int)auVar142._16_4_;
                auVar109._0_16_ = auVar88;
                auVar109._20_4_ = (int)auVar142._20_4_;
                auVar109._24_4_ = (int)auVar142._24_4_;
                auVar109._28_4_ = (int)auVar142._28_4_;
                auVar121 = vpslld_avx(auVar88,0x17);
                auVar88 = vpslld_avx(auVar109._16_16_,0x17);
                auVar160._8_4_ = 0x3f800000;
                auVar160._0_8_ = 0x3f8000003f800000;
                auVar160._12_4_ = 0x3f800000;
                auVar88 = vpaddd_avx(auVar88,auVar160);
                auVar121 = vpaddd_avx(auVar121,auVar160);
                auVar110._16_16_ = auVar88;
                auVar110._0_16_ = auVar121;
                auVar203 = vfmadd213ps_fma(auVar110,auVar235,auVar77);
                auVar146._8_4_ = 0x800000;
                auVar146._0_8_ = 0x80000000800000;
                auVar146._12_4_ = 0x800000;
                auVar146._16_4_ = 0x800000;
                auVar146._20_4_ = 0x800000;
                auVar146._24_4_ = 0x800000;
                auVar146._28_4_ = 0x800000;
                auVar142 = vmaxps_avx(ZEXT1632(auVar203),auVar146);
                auVar121 = vpsrld_avx(auVar142._0_16_,0x17);
                auVar88 = vpsrld_avx(auVar142._16_16_,0x17);
                auVar266._8_4_ = 0x807fffff;
                auVar266._0_8_ = 0x807fffff807fffff;
                auVar266._12_4_ = 0x807fffff;
                auVar266._16_4_ = 0x807fffff;
                auVar266._20_4_ = 0x807fffff;
                auVar266._24_4_ = 0x807fffff;
                auVar266._28_4_ = 0x807fffff;
                auVar142 = vandps_avx(auVar266,auVar142);
                auVar252 = vorps_avx(auVar142,auVar106);
                auVar267._8_4_ = 0x3f3504f3;
                auVar267._0_8_ = 0x3f3504f33f3504f3;
                auVar267._12_4_ = 0x3f3504f3;
                auVar267._16_4_ = 0x3f3504f3;
                auVar267._20_4_ = 0x3f3504f3;
                auVar267._24_4_ = 0x3f3504f3;
                auVar267._28_4_ = 0x3f3504f3;
                auVar82 = vcmpps_avx(auVar267,auVar252,2);
                auVar142 = vandnps_avx(auVar82,auVar252);
                auVar200._8_4_ = 0xbf800000;
                auVar200._0_8_ = 0xbf800000bf800000;
                auVar200._12_4_ = 0xbf800000;
                auVar200._16_4_ = 0xbf800000;
                auVar200._20_4_ = 0xbf800000;
                auVar200._24_4_ = 0xbf800000;
                auVar200._28_4_ = 0xbf800000;
                auVar147._0_4_ = auVar142._0_4_ + auVar252._0_4_ + -1.0;
                auVar147._4_4_ = auVar142._4_4_ + auVar252._4_4_ + -1.0;
                auVar147._8_4_ = auVar142._8_4_ + auVar252._8_4_ + -1.0;
                auVar147._12_4_ = auVar142._12_4_ + auVar252._12_4_ + -1.0;
                auVar147._16_4_ = auVar142._16_4_ + auVar252._16_4_ + -1.0;
                auVar147._20_4_ = auVar142._20_4_ + auVar252._20_4_ + -1.0;
                auVar147._24_4_ = auVar142._24_4_ + auVar252._24_4_ + -1.0;
                auVar147._28_4_ = auVar142._28_4_ + auVar252._28_4_ + -1.0;
                auVar88 = vpsubd_avx(auVar88,auVar82._16_16_);
                auVar270._8_4_ = 0xffffff81;
                auVar270._0_8_ = 0xffffff81ffffff81;
                auVar270._12_4_ = 0xffffff81;
                auVar88 = vpaddd_avx(auVar88,auVar270);
                auVar121 = vpsubd_avx(auVar121,auVar82._0_16_);
                auVar121 = vpaddd_avx(auVar121,auVar270);
                auVar236._16_16_ = auVar88;
                auVar236._0_16_ = auVar121;
                auVar256._0_4_ = auVar147._0_4_ * auVar147._0_4_;
                auVar256._4_4_ = auVar147._4_4_ * auVar147._4_4_;
                auVar256._8_4_ = auVar147._8_4_ * auVar147._8_4_;
                auVar256._12_4_ = auVar147._12_4_ * auVar147._12_4_;
                auVar256._16_4_ = auVar147._16_4_ * auVar147._16_4_;
                auVar256._20_4_ = auVar147._20_4_ * auVar147._20_4_;
                auVar256._24_4_ = auVar147._24_4_ * auVar147._24_4_;
                auVar256._28_4_ = 0;
                auVar268._8_4_ = 0x3d9021bb;
                auVar268._0_8_ = 0x3d9021bb3d9021bb;
                auVar268._12_4_ = 0x3d9021bb;
                auVar268._16_4_ = 0x3d9021bb;
                auVar268._20_4_ = 0x3d9021bb;
                auVar268._24_4_ = 0x3d9021bb;
                auVar268._28_4_ = 0x3d9021bb;
                auVar285._8_4_ = 0xbdebd1b8;
                auVar285._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar285._12_4_ = 0xbdebd1b8;
                auVar285._16_4_ = 0xbdebd1b8;
                auVar285._20_4_ = 0xbdebd1b8;
                auVar285._24_4_ = 0xbdebd1b8;
                auVar285._28_4_ = 0xbdebd1b8;
                auVar88 = vfmadd213ps_fma(auVar268,auVar147,auVar285);
                auVar286._8_4_ = 0x3def251a;
                auVar286._0_8_ = 0x3def251a3def251a;
                auVar286._12_4_ = 0x3def251a;
                auVar286._16_4_ = 0x3def251a;
                auVar286._20_4_ = 0x3def251a;
                auVar286._24_4_ = 0x3def251a;
                auVar286._28_4_ = 0x3def251a;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar286);
                auVar287._8_4_ = 0xbdfe5d4f;
                auVar287._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar287._12_4_ = 0xbdfe5d4f;
                auVar287._16_4_ = 0xbdfe5d4f;
                auVar287._20_4_ = 0xbdfe5d4f;
                auVar287._24_4_ = 0xbdfe5d4f;
                auVar287._28_4_ = 0xbdfe5d4f;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar287);
                auVar288._8_4_ = 0x3e11e9bf;
                auVar288._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar288._12_4_ = 0x3e11e9bf;
                auVar288._16_4_ = 0x3e11e9bf;
                auVar288._20_4_ = 0x3e11e9bf;
                auVar288._24_4_ = 0x3e11e9bf;
                auVar288._28_4_ = 0x3e11e9bf;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar288);
                auVar289._8_4_ = 0xbe2aae50;
                auVar289._0_8_ = 0xbe2aae50be2aae50;
                auVar289._12_4_ = 0xbe2aae50;
                auVar289._16_4_ = 0xbe2aae50;
                auVar289._20_4_ = 0xbe2aae50;
                auVar289._24_4_ = 0xbe2aae50;
                auVar289._28_4_ = 0xbe2aae50;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar289);
                auVar290._8_4_ = 0x3e4cceac;
                auVar290._0_8_ = 0x3e4cceac3e4cceac;
                auVar290._12_4_ = 0x3e4cceac;
                auVar290._16_4_ = 0x3e4cceac;
                auVar290._20_4_ = 0x3e4cceac;
                auVar290._24_4_ = 0x3e4cceac;
                auVar290._28_4_ = 0x3e4cceac;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar290);
                auVar291._8_4_ = 0xbe7ffffc;
                auVar291._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar291._12_4_ = 0xbe7ffffc;
                auVar291._16_4_ = 0xbe7ffffc;
                auVar291._20_4_ = 0xbe7ffffc;
                auVar291._24_4_ = 0xbe7ffffc;
                auVar291._28_4_ = 0xbe7ffffc;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar291);
                auVar292._8_4_ = 0x3eaaaaaa;
                auVar292._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar292._12_4_ = 0x3eaaaaaa;
                auVar292._16_4_ = 0x3eaaaaaa;
                auVar292._20_4_ = 0x3eaaaaaa;
                auVar292._24_4_ = 0x3eaaaaaa;
                auVar292._28_4_ = 0x3eaaaaaa;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar147,auVar292);
                auVar269._0_4_ = auVar256._0_4_ * auVar147._0_4_ * auVar88._0_4_;
                auVar269._4_4_ = auVar256._4_4_ * auVar147._4_4_ * auVar88._4_4_;
                auVar269._8_4_ = auVar256._8_4_ * auVar147._8_4_ * auVar88._8_4_;
                auVar269._12_4_ = auVar256._12_4_ * auVar147._12_4_ * auVar88._12_4_;
                auVar269._16_4_ = auVar256._16_4_ * auVar147._16_4_ * 0.0;
                auVar269._20_4_ = auVar256._20_4_ * auVar147._20_4_ * 0.0;
                auVar269._24_4_ = auVar256._24_4_ * auVar147._24_4_ * 0.0;
                auVar269._28_4_ = 0;
                auVar82 = vcvtdq2ps_avx(auVar236);
                auVar88 = vfmadd231ps_fma(auVar269,auVar82,auVar296);
                auVar88 = vfmsub231ps_fma(ZEXT1632(auVar88),auVar106,auVar256);
                auVar142 = vcmpps_avx(ZEXT1632(auVar203),_DAT_00593200,2);
                auVar252 = vsubps_avx(ZEXT1632(auVar88),auVar147);
                auVar88 = vfmsub231ps_fma(auVar252,auVar307,auVar82);
                auVar293._8_4_ = 0xc0000000;
                auVar293._0_8_ = 0xc0000000c0000000;
                auVar293._12_4_ = 0xc0000000;
                auVar293._16_4_ = 0xc0000000;
                auVar293._20_4_ = 0xc0000000;
                auVar293._24_4_ = 0xc0000000;
                auVar293._28_4_ = 0xc0000000;
                auVar148._0_4_ = auVar88._0_4_ * -2.0;
                auVar148._4_4_ = auVar88._4_4_ * -2.0;
                auVar148._8_4_ = auVar88._8_4_ * -2.0;
                auVar148._12_4_ = auVar88._12_4_ * -2.0;
                auVar148._16_4_ = 0x80000000;
                auVar148._20_4_ = 0x80000000;
                auVar148._24_4_ = 0x80000000;
                auVar148._28_4_ = 0;
                auVar237._8_4_ = 0x7fffffff;
                auVar237._0_8_ = 0x7fffffff7fffffff;
                auVar237._12_4_ = 0x7fffffff;
                auVar237._16_4_ = 0x7fffffff;
                auVar237._20_4_ = 0x7fffffff;
                auVar237._24_4_ = 0x7fffffff;
                auVar237._28_4_ = 0x7fffffff;
                auVar142 = vblendvps_avx(auVar148,auVar237,auVar142);
                auVar142 = vminps_avx(auVar301,auVar142);
                auVar149._8_4_ = 0xc2b0c0a5;
                auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar149._12_4_ = 0xc2b0c0a5;
                auVar149._16_4_ = 0xc2b0c0a5;
                auVar149._20_4_ = 0xc2b0c0a5;
                auVar149._24_4_ = 0xc2b0c0a5;
                auVar149._28_4_ = 0xc2b0c0a5;
                auVar82 = vmaxps_avx(auVar142,auVar149);
                auVar150._8_4_ = 0x3fb8aa3b;
                auVar150._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar150._12_4_ = 0x3fb8aa3b;
                auVar150._16_4_ = 0x3fb8aa3b;
                auVar150._20_4_ = 0x3fb8aa3b;
                auVar150._24_4_ = 0x3fb8aa3b;
                auVar150._28_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar150,auVar82,auVar106);
                auVar252 = vroundps_avx(ZEXT1632(auVar88),1);
                auVar142 = vcmpps_avx(ZEXT1632(auVar88),auVar252,1);
                auVar142 = vandps_avx(auVar77,auVar142);
                auVar142 = vsubps_avx(auVar252,auVar142);
                auVar88 = vfmsub231ps_fma(auVar82,auVar142,auVar307);
                auVar121 = vfnmsub231ps_fma(ZEXT1632(auVar88),auVar142,auVar296);
                auVar82 = ZEXT1632(auVar121);
                auVar17._28_4_ = auVar252._28_4_;
                auVar17._0_28_ =
                     ZEXT1628(CONCAT412(auVar121._12_4_ * auVar121._12_4_,
                                        CONCAT48(auVar121._8_4_ * auVar121._8_4_,
                                                 CONCAT44(auVar121._4_4_ * auVar121._4_4_,
                                                          auVar121._0_4_ * auVar121._0_4_))));
                auVar257._8_4_ = 0x39506967;
                auVar257._0_8_ = 0x3950696739506967;
                auVar257._12_4_ = 0x39506967;
                auVar257._16_4_ = 0x39506967;
                auVar257._20_4_ = 0x39506967;
                auVar257._24_4_ = 0x39506967;
                auVar257._28_4_ = 0x39506967;
                auVar204 = ZEXT3264(auVar77);
                auVar249._8_4_ = 0x3ab743ce;
                auVar249._0_8_ = 0x3ab743ce3ab743ce;
                auVar249._12_4_ = 0x3ab743ce;
                auVar249._16_4_ = 0x3ab743ce;
                auVar249._20_4_ = 0x3ab743ce;
                auVar249._24_4_ = 0x3ab743ce;
                auVar249._28_4_ = 0x3ab743ce;
                auVar88 = vfmadd213ps_fma(auVar257,auVar82,auVar249);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar209);
                auVar210 = ZEXT864(0) << 0x20;
                auVar250._8_4_ = 0x3d2aa9c1;
                auVar250._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar250._12_4_ = 0x3d2aa9c1;
                auVar250._16_4_ = 0x3d2aa9c1;
                auVar250._20_4_ = 0x3d2aa9c1;
                auVar250._24_4_ = 0x3d2aa9c1;
                auVar250._28_4_ = 0x3d2aa9c1;
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar250);
                auVar82 = ZEXT1632(auVar121);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar206);
                auVar207 = ZEXT3264(auVar106);
                auVar88 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar82,auVar106);
                auVar203 = vfmadd213ps_fma(ZEXT1632(auVar88),auVar17,auVar82);
                auVar121._0_4_ = (int)auVar142._0_4_;
                auVar121._4_4_ = (int)auVar142._4_4_;
                auVar121._8_4_ = (int)auVar142._8_4_;
                auVar121._12_4_ = (int)auVar142._12_4_;
                auVar111._16_4_ = (int)auVar142._16_4_;
                auVar111._0_16_ = auVar121;
                auVar111._20_4_ = (int)auVar142._20_4_;
                auVar111._24_4_ = (int)auVar142._24_4_;
                auVar111._28_4_ = (int)auVar142._28_4_;
                auVar121 = vpslld_avx(auVar121,0x17);
                auVar88 = vpslld_avx(auVar111._16_16_,0x17);
                auVar88 = vpaddd_avx(auVar88,auVar160);
                auVar121 = vpaddd_avx(auVar121,auVar160);
                auVar112._16_16_ = auVar88;
                auVar112._0_16_ = auVar121;
                auVar151._0_4_ = auVar203._0_4_ + fVar65;
                auVar151._4_4_ = auVar203._4_4_ + fVar66;
                auVar151._8_4_ = auVar203._8_4_ + fVar193;
                auVar151._12_4_ = auVar203._12_4_ + fVar120;
                auVar151._16_4_ = fVar159 + 0.0;
                auVar151._20_4_ = fVar13 + 0.0;
                auVar151._24_4_ = fVar14 + 0.0;
                auVar151._28_4_ = fVar15 + 0.0;
                auVar88 = vfmadd213ps_fma(auVar112,auVar151,auVar77);
                auVar106 = vrcpps_avx(ZEXT1632(auVar88));
                auVar88 = vfmsub213ps_fma(ZEXT1632(auVar88),auVar106,auVar77);
                auVar88 = vfnmadd132ps_fma(ZEXT1632(auVar88),auVar106,auVar106);
                auVar88 = vfnmadd213ps_fma(ZEXT1632(auVar88),auVar293,auVar200);
                auVar105 = ZEXT1628(auVar88);
                goto LAB_00534b2c;
              case 6:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar118._4_4_ = uVar2;
                auVar118._0_4_ = uVar2;
                auVar118._8_4_ = uVar2;
                auVar118._12_4_ = uVar2;
                auVar118._16_4_ = uVar2;
                auVar118._20_4_ = uVar2;
                auVar118._24_4_ = uVar2;
                auVar118._28_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar155._4_4_ = uVar2;
                auVar155._0_4_ = uVar2;
                auVar155._8_4_ = uVar2;
                auVar155._12_4_ = uVar2;
                auVar155._16_4_ = uVar2;
                auVar155._20_4_ = uVar2;
                auVar155._24_4_ = uVar2;
                auVar155._28_4_ = uVar2;
                auVar88 = vfmadd231ps_fma(auVar155,auVar80,auVar118);
                auVar106 = vmaxps_avx(ZEXT1632(auVar88),auVar142);
                auVar77 = vminps_avx(auVar106,auVar77);
                auVar105 = auVar77._0_28_;
LAB_00534b2c:
                auVar80._4_4_ = auVar105._4_4_ * fVar87;
                auVar80._0_4_ = auVar105._0_4_ * fVar64;
                auVar80._8_4_ = auVar105._8_4_ * auVar80._8_4_;
                auVar80._12_4_ = auVar105._12_4_ * auVar80._12_4_;
                auVar80._16_4_ = auVar105._16_4_ * auVar80._16_4_;
                auVar80._20_4_ = auVar105._20_4_ * auVar80._20_4_;
                auVar80._24_4_ = auVar105._24_4_ * auVar80._24_4_;
              }
              if (iVar56 == 8) {
                *local_1c8 = auVar80;
                local_1c8 = local_1c8 + 1;
              }
              auVar121 = auVar80._16_16_;
              auVar88 = auVar80._0_16_;
              if (iVar56 == 4) {
                *(undefined1 (*) [16])*local_1c8 = auVar88;
                *(undefined1 (*) [16])((long)*local_1c8 + lVar57 * 4) = auVar121;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 0x10);
              }
              if (iVar56 == 1) {
                *(int *)*local_1c8 = auVar80._0_4_;
                uVar2 = vextractps_avx(auVar88,1);
                *(undefined4 *)((long)*local_1c8 + lVar57 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar88,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar88,3);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 3) * 4) = uVar2;
                *(int *)((long)*local_1c8 + (long)(iVar26 * 4) * 4) = auVar80._16_4_;
                uVar2 = vextractps_avx(auVar121,1);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 5) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar121,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 6) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar121,3);
                *(undefined4 *)((long)*local_1c8 + local_90 * 4) = uVar2;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 4);
              }
              local_1e0 = local_1e0 + 1;
              iVar40 = iVar40 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar28 * 4);
              local_1d0 = local_1d0 + lVar28 * 4;
            } while (local_1e0 != lVar29);
          }
          local_1f8 = local_1f8 + 1;
        } while (local_1f8 != uVar49);
      }
      iVar40 = iVar25 + uVar49 * -8;
      iVar56 = iVar40 + 3;
      if (-1 < iVar40) {
        iVar56 = iVar40;
      }
      if (3 < iVar40) {
        local_90 = lVar59 * 4;
        auVar204 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar203._8_4_ = 0x3f000000;
        auVar203._0_8_ = 0x3f0000003f000000;
        auVar203._12_4_ = 0x3f000000;
        auVar205._8_4_ = 0x3f800000;
        auVar205._0_8_ = 0x3f8000003f800000;
        auVar205._12_4_ = 0x3f800000;
        local_150 = 0;
        auVar294._8_4_ = 0xc2b0c0a5;
        auVar294._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar294._12_4_ = 0xc2b0c0a5;
        auVar297._8_4_ = 0x3ab743ce;
        auVar297._0_8_ = 0x3ab743ce3ab743ce;
        auVar297._12_4_ = 0x3ab743ce;
        auVar208._8_4_ = 0x3e2aaaaa;
        auVar208._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar208._12_4_ = 0x3e2aaaaa;
        do {
          lVar57 = (long)top_blob->w;
          if (0 < lVar57) {
            uVar46 = local_d8.h * local_d8.elempack;
            uVar30 = (long)(int)(uVar49 * 8) + local_150 * 4;
            iVar40 = top_blob->elempack;
            uVar54 = (uint)uVar30;
            local_1c8 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)uVar54 >> 0x1f) << 0x20 |
                                     uVar30 & 0xffffffff) / (long)iVar40) * lVar57 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar60 = uVar54 + 7;
            if (-1 < (int)uVar54) {
              uVar60 = uVar54;
            }
            local_1d0 = 0;
            iVar39 = 0;
            local_1e0 = 0;
            local_198 = (Allocator *)local_90;
            do {
              auVar207 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar88 = ZEXT816(0) << 0x40;
              if (lVar7 != 0) {
                auVar88 = *(undefined1 (*) [16])(lVar7 + uVar30 * 4);
              }
              auVar210 = ZEXT1664(auVar88);
              local_118._0_4_ = iVar39;
              pauVar48 = (undefined1 (*) [16])
                         ((this->weight_data_tm).cstep *
                          (long)(((int)(uVar54 - (uVar60 & 0xfffffff8)) >> 2) + ((int)uVar60 >> 3))
                          * (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              if ((int)uVar46 < 8) {
                auVar86 = ZEXT864(0);
                auVar302 = ZEXT864(0);
                uVar24 = 0;
              }
              else {
                auVar302 = ZEXT864(0);
                auVar86 = ZEXT864(0);
                iVar38 = 0;
                do {
                  lVar29 = (long)(iVar38 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar51 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar29 + (long)(local_d8.elempack * iVar45 * (int)local_1e0) * 4);
                  if ((local_d8.elempack == 8) && (0 < iVar4)) {
                    puVar51 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar29 + (long)iVar39 * 4);
                    iVar41 = iVar4;
                    do {
                      uVar2 = *puVar51;
                      auVar161._4_4_ = uVar2;
                      auVar161._0_4_ = uVar2;
                      auVar161._8_4_ = uVar2;
                      auVar161._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar161,auVar210._0_16_,*pauVar48);
                      uVar2 = puVar51[1];
                      auVar239._4_4_ = uVar2;
                      auVar239._0_4_ = uVar2;
                      auVar239._8_4_ = uVar2;
                      auVar239._12_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar239,auVar302._0_16_,pauVar48[1]);
                      uVar2 = puVar51[2];
                      auVar258._4_4_ = uVar2;
                      auVar258._0_4_ = uVar2;
                      auVar258._8_4_ = uVar2;
                      auVar258._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar258,auVar86._0_16_,pauVar48[2]);
                      uVar2 = puVar51[3];
                      auVar271._4_4_ = uVar2;
                      auVar271._0_4_ = uVar2;
                      auVar271._8_4_ = uVar2;
                      auVar271._12_4_ = uVar2;
                      auVar270 = vfmadd132ps_fma(auVar271,auVar207._0_16_,pauVar48[3]);
                      uVar2 = puVar51[4];
                      auVar211._4_4_ = uVar2;
                      auVar211._0_4_ = uVar2;
                      auVar211._8_4_ = uVar2;
                      auVar211._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar211,auVar88,pauVar48[4]);
                      auVar210 = ZEXT1664(auVar88);
                      uVar2 = puVar51[5];
                      auVar303._4_4_ = uVar2;
                      auVar303._0_4_ = uVar2;
                      auVar303._8_4_ = uVar2;
                      auVar303._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar303,auVar121,pauVar48[5]);
                      auVar302 = ZEXT1664(auVar88);
                      uVar2 = puVar51[6];
                      auVar123._4_4_ = uVar2;
                      auVar123._0_4_ = uVar2;
                      auVar123._8_4_ = uVar2;
                      auVar123._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar123,auVar160,pauVar48[6]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[7];
                      auVar89._4_4_ = uVar2;
                      auVar89._0_4_ = uVar2;
                      auVar89._8_4_ = uVar2;
                      auVar89._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar89,auVar270,pauVar48[7]);
                      auVar207 = ZEXT1664(auVar88);
                      pauVar48 = pauVar48 + 8;
                      puVar51 = puVar51 + iVar5 * 8;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar41 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar162._4_4_ = uVar2;
                      auVar162._0_4_ = uVar2;
                      auVar162._8_4_ = uVar2;
                      auVar162._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar162,auVar210._0_16_,*pauVar48);
                      uVar2 = puVar51[1];
                      auVar240._4_4_ = uVar2;
                      auVar240._0_4_ = uVar2;
                      auVar240._8_4_ = uVar2;
                      auVar240._12_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar240,auVar302._0_16_,pauVar48[1]);
                      uVar2 = puVar51[2];
                      auVar259._4_4_ = uVar2;
                      auVar259._0_4_ = uVar2;
                      auVar259._8_4_ = uVar2;
                      auVar259._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar259,auVar86._0_16_,pauVar48[2]);
                      uVar2 = puVar51[3];
                      auVar272._4_4_ = uVar2;
                      auVar272._0_4_ = uVar2;
                      auVar272._8_4_ = uVar2;
                      auVar272._12_4_ = uVar2;
                      auVar270 = vfmadd132ps_fma(auVar272,auVar207._0_16_,pauVar48[3]);
                      uVar2 = puVar51[lVar59];
                      auVar212._4_4_ = uVar2;
                      auVar212._0_4_ = uVar2;
                      auVar212._8_4_ = uVar2;
                      auVar212._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar212,auVar88,pauVar48[4]);
                      auVar210 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 1];
                      auVar304._4_4_ = uVar2;
                      auVar304._0_4_ = uVar2;
                      auVar304._8_4_ = uVar2;
                      auVar304._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar304,auVar121,pauVar48[5]);
                      auVar302 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 2];
                      auVar124._4_4_ = uVar2;
                      auVar124._0_4_ = uVar2;
                      auVar124._8_4_ = uVar2;
                      auVar124._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar124,auVar160,pauVar48[6]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59 + 3];
                      auVar90._4_4_ = uVar2;
                      auVar90._0_4_ = uVar2;
                      auVar90._8_4_ = uVar2;
                      auVar90._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar90,auVar270,pauVar48[7]);
                      auVar207 = ZEXT1664(auVar88);
                      pauVar48 = pauVar48 + 8;
                      puVar51 = puVar51 + iVar5 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar41 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar163._4_4_ = uVar2;
                      auVar163._0_4_ = uVar2;
                      auVar163._8_4_ = uVar2;
                      auVar163._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar163,auVar210._0_16_,*pauVar48);
                      uVar2 = puVar51[lVar59];
                      auVar241._4_4_ = uVar2;
                      auVar241._0_4_ = uVar2;
                      auVar241._8_4_ = uVar2;
                      auVar241._12_4_ = uVar2;
                      auVar121 = vfmadd132ps_fma(auVar241,auVar302._0_16_,pauVar48[1]);
                      uVar2 = puVar51[iVar23 * 2];
                      auVar260._4_4_ = uVar2;
                      auVar260._0_4_ = uVar2;
                      auVar260._8_4_ = uVar2;
                      auVar260._12_4_ = uVar2;
                      auVar160 = vfmadd132ps_fma(auVar260,auVar86._0_16_,pauVar48[2]);
                      uVar2 = puVar51[iVar23 * 3];
                      auVar273._4_4_ = uVar2;
                      auVar273._0_4_ = uVar2;
                      auVar273._8_4_ = uVar2;
                      auVar273._12_4_ = uVar2;
                      auVar270 = vfmadd132ps_fma(auVar273,auVar207._0_16_,pauVar48[3]);
                      uVar2 = puVar51[iVar23 * 4];
                      auVar213._4_4_ = uVar2;
                      auVar213._0_4_ = uVar2;
                      auVar213._8_4_ = uVar2;
                      auVar213._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar213,auVar88,pauVar48[4]);
                      auVar210 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 5];
                      auVar305._4_4_ = uVar2;
                      auVar305._0_4_ = uVar2;
                      auVar305._8_4_ = uVar2;
                      auVar305._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar305,auVar121,pauVar48[5]);
                      auVar302 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 6];
                      auVar125._4_4_ = uVar2;
                      auVar125._0_4_ = uVar2;
                      auVar125._8_4_ = uVar2;
                      auVar125._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar125,auVar160,pauVar48[6]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 7];
                      auVar91._4_4_ = uVar2;
                      auVar91._0_4_ = uVar2;
                      auVar91._8_4_ = uVar2;
                      auVar91._12_4_ = uVar2;
                      auVar88 = vfmadd132ps_fma(auVar91,auVar270,pauVar48[7]);
                      auVar207 = ZEXT1664(auVar88);
                      pauVar48 = pauVar48 + 8;
                      puVar51 = puVar51 + lVar27;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  iVar41 = iVar38 + 0xf;
                  uVar24 = uVar46 & 0xfffffff8;
                  iVar38 = iVar38 + 8;
                } while (iVar41 < (int)uVar46);
              }
              auVar121 = auVar86._0_16_;
              auVar88 = auVar207._0_16_;
              if ((int)(uVar24 | 3) < (int)uVar46) {
                uVar50 = uVar24;
                do {
                  lVar29 = (long)((int)uVar50 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  puVar51 = (undefined4 *)
                            ((long)(_func_int ***)local_d8.data +
                            lVar29 + (long)(local_d8.elempack * iVar45 * (int)local_1e0) * 4);
                  if ((local_d8.elempack == 4) && (0 < iVar4)) {
                    puVar51 = (undefined4 *)
                              ((long)(_func_int ***)local_d8.data + lVar29 + (long)iVar39 * 4);
                    iVar38 = iVar4;
                    do {
                      uVar2 = *puVar51;
                      auVar164._4_4_ = uVar2;
                      auVar164._0_4_ = uVar2;
                      auVar164._8_4_ = uVar2;
                      auVar164._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar210._0_16_,auVar164,*pauVar48);
                      auVar210 = ZEXT1664(auVar88);
                      uVar2 = puVar51[1];
                      auVar165._4_4_ = uVar2;
                      auVar165._0_4_ = uVar2;
                      auVar165._8_4_ = uVar2;
                      auVar165._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar302._0_16_,auVar165,pauVar48[1]);
                      auVar302 = ZEXT1664(auVar88);
                      uVar2 = puVar51[2];
                      auVar166._4_4_ = uVar2;
                      auVar166._0_4_ = uVar2;
                      auVar166._8_4_ = uVar2;
                      auVar166._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_16_,auVar166,pauVar48[2]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[3];
                      auVar167._4_4_ = uVar2;
                      auVar167._0_4_ = uVar2;
                      auVar167._8_4_ = uVar2;
                      auVar167._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar207._0_16_,auVar167,pauVar48[3]);
                      auVar207 = ZEXT1664(auVar88);
                      pauVar48 = pauVar48 + 4;
                      puVar51 = puVar51 + iVar5 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      uVar2 = *puVar51;
                      auVar168._4_4_ = uVar2;
                      auVar168._0_4_ = uVar2;
                      auVar168._8_4_ = uVar2;
                      auVar168._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar210._0_16_,auVar168,*pauVar48);
                      auVar210 = ZEXT1664(auVar88);
                      uVar2 = puVar51[lVar59];
                      auVar169._4_4_ = uVar2;
                      auVar169._0_4_ = uVar2;
                      auVar169._8_4_ = uVar2;
                      auVar169._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar302._0_16_,auVar169,pauVar48[1]);
                      auVar302 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 2];
                      auVar170._4_4_ = uVar2;
                      auVar170._0_4_ = uVar2;
                      auVar170._8_4_ = uVar2;
                      auVar170._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar86._0_16_,auVar170,pauVar48[2]);
                      auVar86 = ZEXT1664(auVar88);
                      uVar2 = puVar51[iVar23 * 3];
                      auVar171._4_4_ = uVar2;
                      auVar171._0_4_ = uVar2;
                      auVar171._8_4_ = uVar2;
                      auVar171._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar207._0_16_,auVar171,pauVar48[3]);
                      auVar207 = ZEXT1664(auVar88);
                      pauVar48 = pauVar48 + 4;
                      puVar51 = puVar51 + lVar27;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar121 = auVar86._0_16_;
                  auVar88 = auVar207._0_16_;
                  uVar24 = uVar50 + 4;
                  iVar38 = uVar50 + 7;
                  uVar50 = uVar24;
                } while (iVar38 < (int)uVar46);
              }
              auVar160 = auVar302._0_16_;
              uVar31 = (ulong)uVar24;
              if ((int)(uVar24 | 1) < (int)uVar46) {
                lVar29 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar34 = lVar29 * uVar31;
                lVar35 = (long)(_func_int ***)local_d8.data + lVar34 + (long)local_198;
                lVar29 = lVar29 * 2;
                lVar34 = (long)(_func_int ***)local_d8.data + lVar34 + local_1d0;
                do {
                  if (0 < iVar4) {
                    lVar61 = 0;
                    iVar38 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)(lVar34 + lVar61);
                      auVar172._4_4_ = uVar2;
                      auVar172._0_4_ = uVar2;
                      auVar172._8_4_ = uVar2;
                      auVar172._12_4_ = uVar2;
                      auVar160 = vfmadd231ps_fma(auVar210._0_16_,auVar172,*pauVar48);
                      auVar210 = ZEXT1664(auVar160);
                      uVar2 = *(undefined4 *)(lVar35 + lVar61);
                      auVar173._4_4_ = uVar2;
                      auVar173._0_4_ = uVar2;
                      auVar173._8_4_ = uVar2;
                      auVar173._12_4_ = uVar2;
                      auVar160 = vfmadd231ps_fma(auVar302._0_16_,auVar173,pauVar48[1]);
                      auVar302 = ZEXT1664(auVar160);
                      pauVar48 = pauVar48 + 2;
                      lVar61 = lVar61 + lVar27 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar160 = auVar302._0_16_;
                  uVar31 = uVar31 + 2;
                  uVar24 = (uint)uVar31;
                  lVar35 = lVar35 + lVar29;
                  lVar34 = lVar34 + lVar29;
                } while ((int)(uVar24 | 1) < (int)uVar46);
              }
              auVar270 = auVar210._0_16_;
              if ((int)uVar24 < (int)uVar46) {
                lVar29 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar31 = (ulong)uVar24;
                puVar51 = (undefined4 *)
                          ((long)(_func_int ***)local_d8.data + lVar29 * uVar31 + local_1d0);
                do {
                  puVar36 = puVar51;
                  iVar38 = iVar4;
                  if (0 < iVar4) {
                    do {
                      uVar2 = *puVar36;
                      auVar174._4_4_ = uVar2;
                      auVar174._0_4_ = uVar2;
                      auVar174._8_4_ = uVar2;
                      auVar174._12_4_ = uVar2;
                      auVar270 = vfmadd231ps_fma(auVar210._0_16_,auVar174,*pauVar48);
                      auVar210 = ZEXT1664(auVar270);
                      pauVar48 = pauVar48 + 1;
                      puVar36 = puVar36 + lVar27;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar270 = auVar210._0_16_;
                  uVar31 = uVar31 + 1;
                  puVar51 = (undefined4 *)((long)puVar51 + lVar29);
                } while ((int)uVar31 < (int)uVar46);
              }
              auVar92._0_4_ = auVar121._0_4_ + auVar88._0_4_ + auVar160._0_4_ + auVar270._0_4_;
              auVar92._4_4_ = auVar121._4_4_ + auVar88._4_4_ + auVar160._4_4_ + auVar270._4_4_;
              auVar92._8_4_ = auVar121._8_4_ + auVar88._8_4_ + auVar160._8_4_ + auVar270._8_4_;
              auVar92._12_4_ = auVar121._12_4_ + auVar88._12_4_ + auVar160._12_4_ + auVar270._12_4_;
              auVar88 = auVar204._0_16_;
              switch(uVar33) {
              case 1:
                auVar92 = vmaxps_avx(auVar88,auVar92);
                break;
              case 2:
                auVar121 = vmaxps_avx(auVar88,auVar92);
                auVar88 = vminps_avx(auVar88,auVar92);
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar95._4_4_ = uVar2;
                auVar95._0_4_ = uVar2;
                auVar95._8_4_ = uVar2;
                auVar95._12_4_ = uVar2;
                auVar92 = vfmadd213ps_fma(auVar95,auVar88,auVar121);
                break;
              case 3:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar128._4_4_ = uVar2;
                auVar128._0_4_ = uVar2;
                auVar128._8_4_ = uVar2;
                auVar128._12_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar181._4_4_ = uVar2;
                auVar181._0_4_ = uVar2;
                auVar181._8_4_ = uVar2;
                auVar181._12_4_ = uVar2;
                auVar88 = vmaxps_avx(auVar92,auVar128);
                auVar92 = vminps_avx(auVar88,auVar181);
                break;
              case 4:
                uVar31 = CONCAT44(auVar92._4_4_,auVar92._0_4_);
                auVar93._0_8_ = uVar31 ^ 0x8000000080000000;
                auVar93._8_4_ = -auVar92._8_4_;
                auVar93._12_4_ = -auVar92._12_4_;
                auVar129._8_4_ = 0x42b0c0a5;
                auVar129._0_8_ = 0x42b0c0a542b0c0a5;
                auVar129._12_4_ = 0x42b0c0a5;
                auVar88 = vminps_avx(auVar93,auVar129);
                auVar130._8_4_ = 0xc2b0c0a5;
                auVar130._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar130._12_4_ = 0xc2b0c0a5;
                auVar160 = vmaxps_avx(auVar88,auVar130);
                auVar131._8_4_ = 0x3fb8aa3b;
                auVar131._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar131._12_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar131,auVar160,auVar203);
                auVar182._0_4_ = (int)auVar88._0_4_;
                auVar182._4_4_ = (int)auVar88._4_4_;
                auVar182._8_4_ = (int)auVar88._8_4_;
                auVar182._12_4_ = (int)auVar88._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar182);
                auVar88 = vcmpps_avx(auVar88,auVar121,1);
                auVar88 = vandps_avx(auVar88,auVar205);
                auVar88 = vsubps_avx(auVar121,auVar88);
                auVar71._8_4_ = 0x3f318000;
                auVar71._0_8_ = 0x3f3180003f318000;
                auVar71._12_4_ = 0x3f318000;
                auVar121 = vfmsub231ps_fma(auVar160,auVar88,auVar71);
                auVar183._8_4_ = 0x395e8083;
                auVar183._0_8_ = 0x395e8083395e8083;
                auVar183._12_4_ = 0x395e8083;
                auVar160 = vfmsub231ps_fma(auVar121,auVar88,auVar183);
                auVar184._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar184._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar184._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar184._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar221._8_4_ = 0x39506967;
                auVar221._0_8_ = 0x3950696739506967;
                auVar221._12_4_ = 0x39506967;
                auVar248._8_4_ = 0x3ab743ce;
                auVar248._0_8_ = 0x3ab743ce3ab743ce;
                auVar248._12_4_ = 0x3ab743ce;
                auVar121 = vfmadd213ps_fma(auVar221,auVar160,auVar248);
                auVar196._8_4_ = 0x3c088908;
                auVar196._0_8_ = 0x3c0889083c088908;
                auVar196._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar196);
                auVar72._8_4_ = 0x3d2aa9c1;
                auVar72._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar72._12_4_ = 0x3d2aa9c1;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar72);
                auVar73._8_4_ = 0x3e2aaaaa;
                auVar73._0_8_ = 0x3e2aaaaa3e2aaaaa;
                auVar73._12_4_ = 0x3e2aaaaa;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar73);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar203);
                auVar121 = vfmadd213ps_fma(auVar121,auVar184,auVar160);
                auVar185._0_4_ = auVar121._0_4_ + 1.0;
                auVar185._4_4_ = auVar121._4_4_ + 1.0;
                auVar185._8_4_ = auVar121._8_4_ + 1.0;
                auVar185._12_4_ = auVar121._12_4_ + 1.0;
                auVar94._0_4_ = (int)auVar88._0_4_;
                auVar94._4_4_ = (int)auVar88._4_4_;
                auVar94._8_4_ = (int)auVar88._8_4_;
                auVar94._12_4_ = (int)auVar88._12_4_;
                auVar88 = vpslld_avx(auVar94,0x17);
                auVar88 = vpaddd_avx(auVar88,auVar205);
                auVar121 = vfmadd213ps_fma(auVar88,auVar185,auVar205);
                auVar88 = vrcpps_avx(auVar121);
                auVar121 = vfmsub213ps_fma(auVar121,auVar88,auVar205);
                auVar92 = vfnmadd132ps_fma(auVar121,auVar88,auVar88);
                break;
              case 5:
                auVar306._8_4_ = 0x42b0c0a5;
                auVar306._0_8_ = 0x42b0c0a542b0c0a5;
                auVar306._12_4_ = 0x42b0c0a5;
                auVar88 = vminps_avx(auVar306,auVar92);
                auVar160 = vmaxps_avx(auVar294,auVar88);
                auVar175._8_4_ = 0x3fb8aa3b;
                auVar175._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar175._12_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar175,auVar160,auVar203);
                auVar214._0_4_ = (int)auVar88._0_4_;
                auVar214._4_4_ = (int)auVar88._4_4_;
                auVar214._8_4_ = (int)auVar88._8_4_;
                auVar214._12_4_ = (int)auVar88._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar214);
                auVar88 = vcmpps_avx(auVar88,auVar121,1);
                auVar88 = vandps_avx(auVar88,auVar205);
                auVar88 = vsubps_avx(auVar121,auVar88);
                auVar68._8_4_ = 0x3f318000;
                auVar68._0_8_ = 0x3f3180003f318000;
                auVar68._12_4_ = 0x3f318000;
                auVar121 = vfmsub231ps_fma(auVar160,auVar88,auVar68);
                auVar251._8_4_ = 0xb95e8083;
                auVar251._0_8_ = 0xb95e8083b95e8083;
                auVar251._12_4_ = 0xb95e8083;
                auVar160 = vfnmsub231ps_fma(auVar121,auVar88,auVar251);
                auVar215._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar215._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar215._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar215._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar242._8_4_ = 0x39506967;
                auVar242._0_8_ = 0x3950696739506967;
                auVar242._12_4_ = 0x39506967;
                auVar121 = vfmadd213ps_fma(auVar242,auVar160,auVar297);
                auVar194._8_4_ = 0x3c088908;
                auVar194._0_8_ = 0x3c0889083c088908;
                auVar194._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar194);
                auVar195._8_4_ = 0x3d2aa9c1;
                auVar195._0_8_ = 0x3d2aa9c13d2aa9c1;
                auVar195._12_4_ = 0x3d2aa9c1;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar195);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar208);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar203);
                auVar121 = vfmadd213ps_fma(auVar121,auVar215,auVar160);
                auVar216._0_4_ = auVar121._0_4_ + 1.0;
                auVar216._4_4_ = auVar121._4_4_ + 1.0;
                auVar216._8_4_ = auVar121._8_4_ + 1.0;
                auVar216._12_4_ = auVar121._12_4_ + 1.0;
                auVar126._0_4_ = (int)auVar88._0_4_;
                auVar126._4_4_ = (int)auVar88._4_4_;
                auVar126._8_4_ = (int)auVar88._8_4_;
                auVar126._12_4_ = (int)auVar88._12_4_;
                auVar88 = vpslld_avx(auVar126,0x17);
                auVar88 = vpaddd_avx(auVar88,auVar205);
                auVar67 = vfmadd213ps_fma(auVar88,auVar216,auVar205);
                auVar176._8_4_ = 0x800000;
                auVar176._0_8_ = 0x80000000800000;
                auVar176._12_4_ = 0x800000;
                auVar88 = vmaxps_avx(auVar67,auVar176);
                auVar121 = vpsrld_avx(auVar88,0x17);
                auVar243._8_4_ = 0xffffff82;
                auVar243._0_8_ = 0xffffff82ffffff82;
                auVar243._12_4_ = 0xffffff82;
                auVar121 = vpaddd_avx(auVar121,auVar243);
                auVar244._8_4_ = 0x807fffff;
                auVar244._0_8_ = 0x807fffff807fffff;
                auVar244._12_4_ = 0x807fffff;
                auVar88 = vandps_avx(auVar244,auVar88);
                auVar270 = vorps_avx(auVar88,auVar203);
                auVar160 = vcvtdq2ps_avx(auVar121);
                auVar245._8_4_ = 0x3f3504f3;
                auVar245._0_8_ = 0x3f3504f33f3504f3;
                auVar245._12_4_ = 0x3f3504f3;
                auVar121 = vcmpps_avx(auVar270,auVar245,1);
                auVar88 = vandps_avx(auVar121,auVar270);
                auVar177._0_4_ = auVar88._0_4_ + auVar270._0_4_ + -1.0;
                auVar177._4_4_ = auVar88._4_4_ + auVar270._4_4_ + -1.0;
                auVar177._8_4_ = auVar88._8_4_ + auVar270._8_4_ + -1.0;
                auVar177._12_4_ = auVar88._12_4_ + auVar270._12_4_ + -1.0;
                auVar88 = vandps_avx(auVar121,auVar205);
                auVar121 = vsubps_avx(auVar160,auVar88);
                auVar246._0_4_ = auVar177._0_4_ * auVar177._0_4_;
                auVar246._4_4_ = auVar177._4_4_ * auVar177._4_4_;
                auVar246._8_4_ = auVar177._8_4_ * auVar177._8_4_;
                auVar246._12_4_ = auVar177._12_4_ * auVar177._12_4_;
                auVar261._8_4_ = 0x3d9021bb;
                auVar261._0_8_ = 0x3d9021bb3d9021bb;
                auVar261._12_4_ = 0x3d9021bb;
                auVar274._8_4_ = 0xbdebd1b8;
                auVar274._0_8_ = 0xbdebd1b8bdebd1b8;
                auVar274._12_4_ = 0xbdebd1b8;
                auVar88 = vfmadd213ps_fma(auVar261,auVar177,auVar274);
                auVar275._8_4_ = 0x3def251a;
                auVar275._0_8_ = 0x3def251a3def251a;
                auVar275._12_4_ = 0x3def251a;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar275);
                auVar276._8_4_ = 0xbdfe5d4f;
                auVar276._0_8_ = 0xbdfe5d4fbdfe5d4f;
                auVar276._12_4_ = 0xbdfe5d4f;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar276);
                auVar277._8_4_ = 0x3e11e9bf;
                auVar277._0_8_ = 0x3e11e9bf3e11e9bf;
                auVar277._12_4_ = 0x3e11e9bf;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar277);
                auVar278._8_4_ = 0xbe2aae50;
                auVar278._0_8_ = 0xbe2aae50be2aae50;
                auVar278._12_4_ = 0xbe2aae50;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar278);
                auVar279._8_4_ = 0x3e4cceac;
                auVar279._0_8_ = 0x3e4cceac3e4cceac;
                auVar279._12_4_ = 0x3e4cceac;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar279);
                auVar280._8_4_ = 0xbe7ffffc;
                auVar280._0_8_ = 0xbe7ffffcbe7ffffc;
                auVar280._12_4_ = 0xbe7ffffc;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar280);
                auVar281._8_4_ = 0x3eaaaaaa;
                auVar281._0_8_ = 0x3eaaaaaa3eaaaaaa;
                auVar281._12_4_ = 0x3eaaaaaa;
                auVar88 = vfmadd213ps_fma(auVar88,auVar177,auVar281);
                auVar262._0_4_ = auVar246._0_4_ * auVar177._0_4_ * auVar88._0_4_;
                auVar262._4_4_ = auVar246._4_4_ * auVar177._4_4_ * auVar88._4_4_;
                auVar262._8_4_ = auVar246._8_4_ * auVar177._8_4_ * auVar88._8_4_;
                auVar262._12_4_ = auVar246._12_4_ * auVar177._12_4_ * auVar88._12_4_;
                auVar88 = vfmadd231ps_fma(auVar262,auVar121,auVar251);
                auVar160 = vfmsub231ps_fma(auVar88,auVar203,auVar246);
                auVar88 = vcmpps_avx(auVar67,_DAT_005930d0,2);
                auVar160 = vsubps_avx(auVar160,auVar177);
                auVar121 = vfnmadd231ps_fma(auVar160,auVar68,auVar121);
                auVar178._0_4_ = auVar121._0_4_ + auVar121._0_4_;
                auVar178._4_4_ = auVar121._4_4_ + auVar121._4_4_;
                auVar178._8_4_ = auVar121._8_4_ + auVar121._8_4_;
                auVar178._12_4_ = auVar121._12_4_ + auVar121._12_4_;
                auVar217._8_4_ = 0x7fffffff;
                auVar217._0_8_ = 0x7fffffff7fffffff;
                auVar217._12_4_ = 0x7fffffff;
                auVar88 = vblendvps_avx(auVar178,auVar217,auVar88);
                auVar88 = vminps_avx(auVar306,auVar88);
                auVar160 = vmaxps_avx(auVar294,auVar88);
                auVar179._8_4_ = 0x3fb8aa3b;
                auVar179._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar179._12_4_ = 0x3fb8aa3b;
                auVar88 = vfmadd213ps_fma(auVar179,auVar160,auVar203);
                auVar218._0_4_ = (int)auVar88._0_4_;
                auVar218._4_4_ = (int)auVar88._4_4_;
                auVar218._8_4_ = (int)auVar88._8_4_;
                auVar218._12_4_ = (int)auVar88._12_4_;
                auVar121 = vcvtdq2ps_avx(auVar218);
                auVar88 = vcmpps_avx(auVar88,auVar121,1);
                auVar88 = vandps_avx(auVar88,auVar205);
                auVar88 = vsubps_avx(auVar121,auVar88);
                auVar121 = vfmsub231ps_fma(auVar160,auVar88,auVar68);
                auVar160 = vfnmsub231ps_fma(auVar121,auVar88,auVar251);
                auVar219._0_4_ = auVar160._0_4_ * auVar160._0_4_;
                auVar219._4_4_ = auVar160._4_4_ * auVar160._4_4_;
                auVar219._8_4_ = auVar160._8_4_ * auVar160._8_4_;
                auVar219._12_4_ = auVar160._12_4_ * auVar160._12_4_;
                auVar247._8_4_ = 0x39506967;
                auVar247._0_8_ = 0x3950696739506967;
                auVar247._12_4_ = 0x39506967;
                auVar204 = ZEXT864(0);
                auVar121 = vfmadd213ps_fma(auVar247,auVar160,auVar297);
                auVar69._8_4_ = 0x3c088908;
                auVar69._0_8_ = 0x3c0889083c088908;
                auVar69._12_4_ = 0x3c088908;
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar69);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar195);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar208);
                auVar121 = vfmadd213ps_fma(auVar121,auVar160,auVar203);
                auVar121 = vfmadd213ps_fma(auVar121,auVar219,auVar160);
                auVar127._0_4_ = auVar121._0_4_ + 1.0;
                auVar127._4_4_ = auVar121._4_4_ + 1.0;
                auVar127._8_4_ = auVar121._8_4_ + 1.0;
                auVar127._12_4_ = auVar121._12_4_ + 1.0;
                auVar180._0_4_ = (int)auVar88._0_4_;
                auVar180._4_4_ = (int)auVar88._4_4_;
                auVar180._8_4_ = (int)auVar88._8_4_;
                auVar180._12_4_ = (int)auVar88._12_4_;
                auVar88 = vpslld_avx(auVar180,0x17);
                auVar88 = vpaddd_avx(auVar88,auVar205);
                auVar121 = vfmadd213ps_fma(auVar88,auVar127,auVar205);
                auVar88 = vrcpps_avx(auVar121);
                auVar220._0_4_ = auVar88._0_4_ + auVar88._0_4_;
                auVar220._4_4_ = auVar88._4_4_ + auVar88._4_4_;
                auVar220._8_4_ = auVar88._8_4_ + auVar88._8_4_;
                auVar220._12_4_ = auVar88._12_4_ + auVar88._12_4_;
                auVar70._8_4_ = 0x40000000;
                auVar70._0_8_ = 0x4000000040000000;
                auVar70._12_4_ = 0x40000000;
                auVar121 = vfmsub213ps_fma(auVar121,auVar220,auVar70);
                auVar88 = vfnmadd213ps_fma(auVar121,auVar88,auVar220);
                auVar92 = vfmsub231ps_fma(auVar92,auVar92,auVar88);
                break;
              case 6:
                uVar2 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var6);
                auVar132._4_4_ = uVar2;
                auVar132._0_4_ = uVar2;
                auVar132._8_4_ = uVar2;
                auVar132._12_4_ = uVar2;
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var6))[1];
                auVar186._4_4_ = uVar2;
                auVar186._0_4_ = uVar2;
                auVar186._8_4_ = uVar2;
                auVar186._12_4_ = uVar2;
                auVar121 = vfmadd231ps_fma(auVar186,auVar92,auVar132);
                auVar88 = vmaxps_avx(auVar88,auVar121);
                auVar88 = vminps_avx(auVar88,auVar205);
                auVar92._0_4_ = auVar88._0_4_ * auVar92._0_4_;
                auVar92._4_4_ = auVar88._4_4_ * auVar92._4_4_;
                auVar92._8_4_ = auVar88._8_4_ * auVar92._8_4_;
                auVar92._12_4_ = auVar88._12_4_ * auVar92._12_4_;
              }
              if (iVar40 == 4) {
                *(undefined1 (*) [16])local_1c8 = auVar92;
                local_1c8 = (undefined1 (*) [32])((long)local_1c8 + 0x10);
              }
              if (iVar40 == 1) {
                *(int *)*local_1c8 = auVar92._0_4_;
                uVar2 = vextractps_avx(auVar92,1);
                *(undefined4 *)((long)*local_1c8 + (long)iVar26 * 4) = uVar2;
                uVar2 = vextractps_avx(auVar92,2);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 2) * 4) = uVar2;
                uVar2 = vextractps_avx(auVar92,3);
                *(undefined4 *)((long)*local_1c8 + (long)(iVar26 * 3) * 4) = uVar2;
                local_1c8 = (undefined1 (*) [32])((long)*local_1c8 + 4);
              }
              local_1e0 = local_1e0 + 1;
              iVar39 = iVar39 + iVar45 * local_d8.elempack;
              local_198 = (Allocator *)((long)local_198 + lVar28 * 4);
              local_1d0 = local_1d0 + lVar28 * 4;
            } while (local_1e0 != lVar57);
          }
          local_150 = local_150 + 1;
        } while (local_150 != (uint)(iVar56 >> 2));
      }
      uVar33 = uVar49 * 8 + (iVar56 >> 2) * 4;
      local_68 = (ulong)uVar33;
      local_70 = (ulong)(uint)((int)(iVar25 - uVar33) / 2);
      if (1 < (int)(iVar25 - uVar33)) {
        iVar56 = local_d8.h * local_d8.elempack;
        uVar49 = top_blob->w;
        lVar29 = (long)(int)uVar49 * top_blob->elemsize;
        iVar25 = local_d8.elempack * iVar45;
        local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar63 = local_d8.elempack == 1;
        local_90 = CONCAT44(local_90._4_4_,iVar56) & 0xfffffffffffffff8;
        iVar26 = local_d8.elempack * iVar45;
        lVar34 = (long)(iVar5 * 4) * 4;
        local_40 = top_blob->data;
        local_48 = (this->weight_data_tm).data;
        local_50 = (long)(int)uVar33;
        lVar57 = lVar27 * 4;
        local_58 = lVar59 * 4;
        local_148 = 0;
        local_78 = local_70;
        do {
          pvVar9 = local_d8.data;
          if (0 < (int)uVar49) {
            lVar35 = local_50 + local_148 * 2;
            pfVar55 = (float *)((local_50 + local_148 * 2 + 1) * lVar29 + (long)local_40);
            pfVar62 = (float *)(lVar35 * lVar29 + (long)local_40);
            uVar33 = (uint)lVar35;
            uVar46 = uVar33 + 3;
            uVar60 = uVar33 + 7;
            if (-1 < (int)uVar33) {
              uVar46 = uVar33;
              uVar60 = uVar33;
            }
            iVar39 = uVar33 - (uVar60 & 0xfffffff8);
            iVar40 = (uVar33 - (uVar60 & 0xfffffff8)) + 3;
            if (-1 < iVar39) {
              iVar40 = iVar39;
            }
            pauVar47 = (undefined1 (*) [32])
                       ((((int)(uVar33 - (uVar46 & 0xfffffffc)) >> 1) + ((int)uVar60 >> 3) +
                        (iVar40 >> 2)) * local_38 + (long)local_48);
            lVar61 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar8 = *(float **)(&this->field_0xf8 + (long)p_Var6);
            local_128 = (long)(_func_int ***)local_d8.data + local_58;
            iVar40 = 0;
            local_160 = (Allocator *)local_d8.data;
            local_1b8 = 0;
            do {
              if (lVar7 == 0) {
                fVar65 = 0.0;
                fVar66 = 0.0;
              }
              else {
                pfVar1 = (float *)(lVar7 + lVar35 * 4);
                fVar65 = *pfVar1;
                fVar66 = pfVar1[1];
              }
              pvVar42 = (void *)((long)iVar40 * 4);
              pauVar52 = pauVar47;
              if (iVar56 < 8) {
                uVar33 = 0;
                auVar77 = SUB6432(ZEXT864(0),0);
                auVar307 = SUB6432(ZEXT864(0),0);
              }
              else {
                auVar204 = ZEXT864(0);
                auVar207 = ZEXT864(0);
                iVar39 = 0;
                do {
                  lVar58 = (iVar39 / iVar3) * lVar61;
                  pauVar32 = (undefined1 (*) [32])
                             ((long)(_func_int ***)pvVar9 +
                             lVar58 + (long)(iVar25 * (int)local_1b8) * 4);
                  if ((iVar3 == 8) && (0 < iVar4)) {
                    pauVar32 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar9 + (long)(lVar58 + (long)pvVar42));
                    iVar38 = iVar4;
                    do {
                      auVar88 = vfmadd231ps_fma(auVar207._0_32_,*pauVar32,*pauVar52);
                      auVar207 = ZEXT1664(auVar88);
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,*pauVar32,pauVar52[1]);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 2;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar5 * 8) * 4);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((iVar3 == 4) && (iVar38 = iVar4, 0 < iVar4)) {
                    do {
                      auVar191._16_16_ = *(undefined1 (*) [16])(*pauVar32 + lVar59 * 4);
                      auVar191._0_16_ = *(undefined1 (*) [16])*pauVar32;
                      auVar88 = vfmadd231ps_fma(auVar207._0_32_,auVar191,*pauVar52);
                      auVar207 = ZEXT1664(auVar88);
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,auVar191,pauVar52[1]);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 2;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar34);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar4;
                  if (0 < iVar4 && bVar63) {
                    do {
                      auVar88 = vinsertps_avx(ZEXT416(*(uint *)*pauVar32),
                                              ZEXT416(*(uint *)(*pauVar32 + lVar59 * 4)),0x10);
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar32 +
                                                                       (long)(iVar23 * 2) * 4)),0x20
                                             );
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar32 +
                                                                       (long)(iVar23 * 3) * 4)),0x30
                                             );
                      auVar121 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar32 + (long)(iVar23 * 4) * 4)
                                                      ),ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 5) * 4)),
                                               0x10);
                      auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 6) * 4)),
                                               0x20);
                      auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 7) * 4)),
                                               0x30);
                      auVar192._16_16_ = auVar121;
                      auVar192._0_16_ = auVar88;
                      auVar88 = vfmadd231ps_fma(auVar207._0_32_,auVar192,*pauVar52);
                      auVar207 = ZEXT1664(auVar88);
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,auVar192,pauVar52[1]);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 2;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar57);
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar307 = auVar204._0_32_;
                  auVar77 = auVar207._0_32_;
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                } while (iVar38 < iVar56);
                uVar33 = (uint)local_90;
              }
              auVar88 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar88);
              if ((int)(uVar33 | 3) < iVar56) {
                pvVar42 = (void *)((long)(_func_int ***)pvVar9 + (long)pvVar42);
                auVar207 = ZEXT864(0);
                uVar60 = uVar33;
                do {
                  lVar58 = ((int)uVar60 / iVar3) * lVar61;
                  pauVar48 = (undefined1 (*) [16])
                             ((long)(_func_int ***)pvVar9 +
                             lVar58 + (long)(iVar25 * (int)local_1b8) * 4);
                  if ((iVar3 == 4) && (0 < iVar4)) {
                    pauVar48 = (undefined1 (*) [16])(lVar58 + (long)pvVar42);
                    iVar39 = iVar4;
                    do {
                      auVar88 = vfmadd231ps_fma(auVar204._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      auVar88 = vfmadd231ps_fma(auVar207._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])(*pauVar52 + 0x10));
                      auVar207 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 1;
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar34);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  iVar39 = iVar4;
                  if (0 < iVar4 && bVar63) {
                    do {
                      auVar88 = vinsertps_avx(ZEXT416(*(uint *)*pauVar48),
                                              ZEXT416(*(uint *)(*pauVar48 + lVar59 * 4)),0x10);
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar23 * 2) * 4)),0x20
                                             );
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar23 * 3) * 4)),0x30
                                             );
                      auVar121 = vfmadd231ps_fma(auVar204._0_16_,auVar88,
                                                 *(undefined1 (*) [16])*pauVar52);
                      auVar204 = ZEXT1664(auVar121);
                      auVar88 = vfmadd231ps_fma(auVar207._0_16_,auVar88,
                                                *(undefined1 (*) [16])(*pauVar52 + 0x10));
                      auVar207 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 1;
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar57);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar121 = auVar207._0_16_;
                  auVar88 = auVar204._0_16_;
                  uVar33 = uVar60 + 4;
                  iVar39 = uVar60 + 7;
                  uVar60 = uVar33;
                } while (iVar39 < iVar56);
              }
              else {
                auVar121 = SUB6416(ZEXT864(0),0);
              }
              local_118._0_8_ = pvVar42;
              uVar30 = (ulong)uVar33;
              auVar133._0_4_ = auVar77._16_4_ + auVar77._0_4_;
              auVar133._4_4_ = auVar77._20_4_ + auVar77._4_4_;
              auVar133._8_4_ = auVar77._24_4_ + auVar77._8_4_;
              auVar133._12_4_ = auVar77._28_4_ + auVar77._12_4_;
              auVar203 = vshufpd_avx(auVar133,auVar133,1);
              auVar134._0_4_ = auVar203._0_4_ + auVar133._0_4_;
              auVar134._4_4_ = auVar203._4_4_ + auVar133._4_4_;
              auVar134._8_4_ = auVar203._8_4_ + auVar133._8_4_;
              auVar134._12_4_ = auVar203._12_4_ + auVar133._12_4_;
              auVar96._0_4_ = auVar307._16_4_ + auVar307._0_4_;
              auVar96._4_4_ = auVar307._20_4_ + auVar307._4_4_;
              auVar96._8_4_ = auVar307._24_4_ + auVar307._8_4_;
              auVar96._12_4_ = auVar307._28_4_ + auVar307._12_4_;
              auVar203 = vshufpd_avx(auVar96,auVar96,1);
              auVar97._0_4_ = auVar203._0_4_ + auVar96._0_4_;
              auVar97._4_4_ = auVar203._4_4_ + auVar96._4_4_;
              auVar97._8_4_ = auVar203._8_4_ + auVar96._8_4_;
              auVar97._12_4_ = auVar203._12_4_ + auVar96._12_4_;
              auVar203 = vshufpd_avx(auVar88,auVar88,1);
              auVar197._0_4_ = auVar203._0_4_ + auVar88._0_4_;
              auVar197._4_4_ = auVar203._4_4_ + auVar88._4_4_;
              auVar197._8_4_ = auVar203._8_4_ + auVar88._8_4_;
              auVar197._12_4_ = auVar203._12_4_ + auVar88._12_4_;
              auVar88 = vinsertps_avx(auVar97,auVar134,0x4c);
              auVar203 = vshufpd_avx(auVar121,auVar121,1);
              auVar187._0_4_ = auVar203._0_4_ + auVar121._0_4_;
              auVar187._4_4_ = auVar203._4_4_ + auVar121._4_4_;
              auVar187._8_4_ = auVar203._8_4_ + auVar121._8_4_;
              auVar187._12_4_ = auVar203._12_4_ + auVar121._12_4_;
              auVar121 = vinsertps_avx(auVar134,auVar97,0x1c);
              auVar203 = vinsertps_avx(auVar187,auVar197,0x4c);
              auVar160 = vinsertps_avx(auVar197,auVar187,0x1c);
              auVar204 = ZEXT1664(CONCAT412(auVar88._12_4_ + 0.0 + auVar121._12_4_ + auVar203._12_4_
                                            + auVar160._12_4_,
                                            CONCAT48(auVar88._8_4_ + 0.0 +
                                                     auVar121._8_4_ + auVar203._8_4_ +
                                                     auVar160._8_4_,
                                                     CONCAT44(auVar88._4_4_ + fVar66 +
                                                              auVar121._4_4_ + auVar203._4_4_ +
                                                              auVar160._4_4_,
                                                              auVar88._0_4_ + fVar65 +
                                                              auVar121._0_4_ + auVar203._0_4_ +
                                                              auVar160._0_4_))));
              if ((int)(uVar33 | 1) < iVar56) {
                lVar58 = local_128 + lVar61 * uVar30;
                ppp_Var37 = (_func_int ***)((long)&local_160->_vptr_Allocator + lVar61 * uVar30);
                do {
                  if (0 < iVar4) {
                    lVar53 = 0;
                    iVar39 = iVar4;
                    do {
                      uVar2 = *(undefined4 *)((long)ppp_Var37 + lVar53);
                      auVar74._4_4_ = uVar2;
                      auVar74._0_4_ = uVar2;
                      auVar74._8_4_ = uVar2;
                      auVar74._12_4_ = uVar2;
                      auVar98._8_8_ = 0;
                      auVar98._0_8_ = *(ulong *)*pauVar52;
                      auVar88 = vfmadd213ps_fma(auVar98,auVar74,auVar204._0_16_);
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = *(ulong *)(*pauVar52 + 8);
                      uVar2 = *(undefined4 *)(lVar58 + lVar53);
                      auVar198._4_4_ = uVar2;
                      auVar198._0_4_ = uVar2;
                      auVar198._8_4_ = uVar2;
                      auVar198._12_4_ = uVar2;
                      auVar88 = vfmadd213ps_fma(auVar198,auVar75,auVar88);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                      lVar53 = lVar53 + lVar57;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar30 = uVar30 + 2;
                  uVar33 = (uint)uVar30;
                  lVar58 = lVar58 + lVar61 * 2;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar61 * 2);
                } while ((int)(uVar33 | 1) < iVar56);
              }
              auVar88 = auVar204._0_16_;
              if ((int)uVar33 < iVar56) {
                uVar30 = (ulong)uVar33;
                ppp_Var37 = (_func_int ***)((long)&local_160->_vptr_Allocator + lVar61 * uVar30);
                do {
                  ppp_Var44 = ppp_Var37;
                  iVar39 = iVar4;
                  if (0 < iVar4) {
                    do {
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = *(ulong *)*pauVar52;
                      uVar2 = *(undefined4 *)ppp_Var44;
                      auVar99._4_4_ = uVar2;
                      auVar99._0_4_ = uVar2;
                      auVar99._8_4_ = uVar2;
                      auVar99._12_4_ = uVar2;
                      auVar88 = vfmadd231ps_fma(auVar204._0_16_,auVar76,auVar99);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 8);
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar57);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar88 = auVar204._0_16_;
                  uVar30 = uVar30 + 1;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar61);
                } while ((int)uVar30 < iVar56);
              }
              iVar39 = (int)local_80 + -1;
              fVar66 = auVar88._0_4_;
              fVar65 = fVar66;
              switch(iVar39) {
              case 0:
                auVar121 = vmaxss_avx(auVar88,ZEXT416(0));
                fVar65 = auVar121._0_4_;
                break;
              case 1:
                auVar121 = vcmpss_avx(ZEXT816(0) << 0x40,auVar88,1);
                auVar136._8_4_ = 0x3f800000;
                auVar136._0_8_ = 0x3f8000003f800000;
                auVar136._12_4_ = 0x3f800000;
                auVar121 = vblendvps_avx(ZEXT416((uint)*pfVar8),auVar136,auVar121);
                fVar65 = auVar121._0_4_;
                goto LAB_00535f8f;
              case 2:
                auVar121 = vmaxss_avx(auVar88,ZEXT416((uint)*pfVar8));
                fVar65 = auVar121._0_4_;
                if (pfVar8[1] < auVar121._0_4_) {
                  fVar65 = pfVar8[1];
                }
                break;
              case 3:
                auVar121 = vminss_avx(auVar88,ZEXT416(0x42b0c0a5));
                auVar100._0_8_ = auVar121._0_8_ ^ 0x8000000080000000;
                auVar100._8_4_ = auVar121._8_4_ ^ 0x80000000;
                auVar100._12_4_ = auVar121._12_4_ ^ 0x80000000;
                auVar121 = vcmpss_avx(auVar121,ZEXT416(0xc2b0c0a5),1);
                auVar135._8_4_ = 0x42b0c0a5;
                auVar135._0_8_ = 0x42b0c0a542b0c0a5;
                auVar135._12_4_ = 0x42b0c0a5;
                auVar121 = vblendvps_avx(auVar100,auVar135,auVar121);
                fVar65 = expf(auVar121._0_4_);
                fVar65 = 1.0 / (fVar65 + 1.0);
                break;
              case 4:
                fVar65 = expf(fVar66);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
LAB_00535f8f:
                fVar65 = fVar65 * fVar66;
                break;
              case 5:
                fVar193 = *pfVar8;
                fVar120 = -pfVar8[1] / fVar193;
                fVar65 = 0.0;
                if ((fVar120 <= fVar66) && (fVar65 = fVar66, fVar66 <= fVar120 + 1.0 / fVar193)) {
                  auVar121 = vfmadd213ss_fma(ZEXT416((uint)fVar193),auVar88,ZEXT416((uint)pfVar8[1])
                                            );
                  fVar65 = auVar121._0_4_;
                  goto LAB_00535f8f;
                }
              }
              auVar88 = vmovshdup_avx(auVar88);
              fVar193 = auVar88._0_4_;
              fVar66 = fVar193;
              switch(iVar39) {
              case 0:
                auVar88 = vmaxss_avx(auVar88,ZEXT416(0));
                fVar66 = auVar88._0_4_;
                break;
              case 1:
                auVar88 = vcmpss_avx(ZEXT816(0) << 0x40,auVar88,1);
                auVar138._8_4_ = 0x3f800000;
                auVar138._0_8_ = 0x3f8000003f800000;
                auVar138._12_4_ = 0x3f800000;
                auVar88 = vblendvps_avx(ZEXT416((uint)*pfVar8),auVar138,auVar88);
                fVar66 = auVar88._0_4_ * fVar193;
                break;
              case 2:
                auVar88 = vmaxss_avx(auVar88,ZEXT416((uint)*pfVar8));
                fVar66 = auVar88._0_4_;
                if (pfVar8[1] < auVar88._0_4_) {
                  fVar66 = pfVar8[1];
                }
                break;
              case 3:
                auVar88 = vminss_avx(auVar88,ZEXT416(0x42b0c0a5));
                auVar101._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar101._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar101._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar88 = vcmpss_avx(auVar88,ZEXT416(0xc2b0c0a5),1);
                auVar137._8_4_ = 0x42b0c0a5;
                auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                auVar137._12_4_ = 0x42b0c0a5;
                auVar88 = vblendvps_avx(auVar101,auVar137,auVar88);
                fVar66 = expf(auVar88._0_4_);
                fVar66 = 1.0 / (fVar66 + 1.0);
                break;
              case 4:
                fVar66 = expf(fVar193);
                fVar66 = logf(fVar66 + 1.0);
                fVar66 = tanhf(fVar66);
                local_118 = auVar88;
                fVar66 = fVar66 * fVar193;
                break;
              case 5:
                fVar120 = *pfVar8;
                fVar159 = -pfVar8[1] / fVar120;
                fVar66 = 0.0;
                if ((fVar159 <= fVar193) && (fVar66 = fVar193, fVar193 <= fVar159 + 1.0 / fVar120))
                {
                  auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar120),auVar88,ZEXT416((uint)pfVar8[1]))
                  ;
                  fVar66 = auVar88._0_4_ * fVar193;
                }
              }
              *pfVar62 = fVar65;
              *pfVar55 = fVar66;
              pfVar62 = pfVar62 + 1;
              pfVar55 = pfVar55 + 1;
              local_1b8 = local_1b8 + 1;
              iVar40 = iVar40 + iVar26;
              local_128 = local_128 + lVar28 * 4;
              local_160 = (Allocator *)((long)&local_160->_vptr_Allocator + lVar28 * 4);
            } while (local_1b8 != uVar49);
          }
          local_148 = local_148 + 1;
        } while (local_148 != local_78);
      }
      iVar25 = (int)local_68 + (int)local_70 * 2;
      if (iVar25 < (int)local_88) {
        pvVar9 = top_blob->data;
        iVar26 = top_blob->w;
        sVar10 = top_blob->elemsize;
        sVar11 = (this->weight_data_tm).elemsize;
        sVar12 = (this->weight_data_tm).cstep;
        bVar63 = 0 < iVar4;
        local_130 = uVar22 & 0xfffffff8;
        local_1a0 = (ulong)iVar25;
        lVar57 = (long)(iVar5 * 4) * 4;
        lVar27 = lVar27 * 4;
        pvVar42 = (this->weight_data_tm).data;
        do {
          pvVar21 = local_d8.data;
          if (0 < (int)local_60) {
            pfVar55 = (float *)((long)iVar26 * sVar10 * local_1a0 + (long)pvVar9);
            uVar33 = (uint)local_1a0;
            uVar60 = uVar33 + 3;
            uVar49 = uVar33 + 7;
            if (-1 < (int)uVar33) {
              uVar60 = uVar33;
              uVar49 = uVar33;
            }
            iVar56 = uVar33 - (uVar49 & 0xfffffff8);
            iVar25 = (uVar33 - (uVar49 & 0xfffffff8)) + 3;
            if (-1 < iVar56) {
              iVar25 = iVar56;
            }
            pauVar47 = (undefined1 (*) [32])
                       ((long)(int)((uVar33 - (((uint)(local_1a0 >> 0x1f) & 1) + uVar33 & 0xfffffffe
                                              )) + ((int)uVar49 >> 3) +
                                    (int)(uVar33 - (uVar60 & 0xfffffffc)) / 2 + (iVar25 >> 2)) *
                        sVar11 * sVar12 + (long)pvVar42);
            lVar29 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar62 = *(float **)(&this->field_0xf8 + (long)p_Var6);
            local_1b0 = (void *)((long)(_func_int ***)local_d8.data + lVar59 * 4);
            iVar25 = 0;
            local_198 = (Allocator *)local_d8.data;
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_118._8_8_;
            local_118 = auVar20 << 0x40;
            do {
              if (lVar7 == 0) {
                fVar65 = 0.0;
              }
              else {
                fVar65 = *(float *)(lVar7 + local_1a0 * 4);
              }
              pauVar52 = pauVar47;
              if ((int)uVar22 < 8) {
                auVar307 = SUB6432(ZEXT864(0),0);
                uVar33 = 0;
              }
              else {
                auVar204 = ZEXT864(0);
                iVar56 = 0;
                do {
                  lVar34 = (iVar56 / iVar3) * lVar29;
                  if (iVar3 == 8 && bVar63) {
                    pauVar32 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar21 + lVar34 + (long)iVar25 * 4);
                    iVar40 = iVar4;
                    do {
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,*pauVar32,*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 1;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + (long)(iVar5 * 8) * 4);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  else {
                    pauVar32 = (undefined1 (*) [32])
                               ((long)(_func_int ***)pvVar21 +
                               lVar34 + (long)(iVar3 * iVar45 * local_118._0_4_) * 4);
                  }
                  iVar40 = iVar4;
                  if (iVar3 == 4 && bVar63) {
                    do {
                      auVar156._16_16_ = *(undefined1 (*) [16])(*pauVar32 + lVar59 * 4);
                      auVar156._0_16_ = *(undefined1 (*) [16])*pauVar32;
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,auVar156,*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 1;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar57);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  iVar40 = iVar4;
                  if (iVar3 == 1 && bVar63) {
                    do {
                      auVar88 = vinsertps_avx(ZEXT416(*(uint *)*pauVar32),
                                              ZEXT416(*(uint *)(*pauVar32 + lVar59 * 4)),0x10);
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar32 +
                                                                       (long)(iVar23 * 2) * 4)),0x20
                                             );
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar32 +
                                                                       (long)(iVar23 * 3) * 4)),0x30
                                             );
                      auVar121 = vinsertps_avx(ZEXT416(*(uint *)(*pauVar32 + (long)(iVar23 * 4) * 4)
                                                      ),ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 5) * 4)),
                                               0x10);
                      auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 6) * 4)),
                                               0x20);
                      auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(*pauVar32 +
                                                                         (long)(iVar23 * 7) * 4)),
                                               0x30);
                      auVar157._16_16_ = auVar121;
                      auVar157._0_16_ = auVar88;
                      auVar88 = vfmadd231ps_fma(auVar204._0_32_,auVar157,*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = pauVar52 + 1;
                      pauVar32 = (undefined1 (*) [32])(*pauVar32 + lVar27);
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  auVar307 = auVar204._0_32_;
                  iVar40 = iVar56 + 0xf;
                  iVar56 = iVar56 + 8;
                  uVar33 = local_130;
                } while (iVar40 < (int)uVar22);
              }
              auVar88 = ZEXT816(0) << 0x40;
              auVar204 = ZEXT1664(auVar88);
              if ((int)(uVar33 | 3) < (int)uVar22) {
                uVar49 = uVar33;
                do {
                  lVar34 = ((int)uVar49 / iVar3) * lVar29;
                  if (iVar3 == 4 && bVar63) {
                    pauVar48 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar21 + lVar34 + (long)iVar25 * 4);
                    iVar56 = iVar4;
                    do {
                      auVar88 = vfmadd231ps_fma(auVar204._0_16_,*pauVar48,
                                                *(undefined1 (*) [16])*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar57);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  else {
                    pauVar48 = (undefined1 (*) [16])
                               ((long)(_func_int ***)pvVar21 +
                               lVar34 + (long)(iVar3 * iVar45 * local_118._0_4_) * 4);
                  }
                  iVar56 = iVar4;
                  if (iVar3 == 1 && bVar63) {
                    do {
                      auVar88 = vinsertps_avx(ZEXT416(*(uint *)*pauVar48),
                                              ZEXT416(*(uint *)(*pauVar48 + lVar59 * 4)),0x10);
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar23 * 2) * 4)),0x20
                                             );
                      auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(*pauVar48 +
                                                                       (long)(iVar23 * 3) * 4)),0x30
                                             );
                      auVar88 = vfmadd231ps_fma(auVar204._0_16_,auVar88,
                                                *(undefined1 (*) [16])*pauVar52);
                      auVar204 = ZEXT1664(auVar88);
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 0x10);
                      pauVar48 = (undefined1 (*) [16])(*pauVar48 + lVar27);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar88 = auVar204._0_16_;
                  uVar33 = uVar49 + 4;
                  iVar56 = uVar49 + 7;
                  uVar49 = uVar33;
                } while (iVar56 < (int)uVar22);
              }
              uVar30 = (ulong)uVar33;
              auVar102._0_4_ = auVar307._16_4_ + auVar307._0_4_;
              auVar102._4_4_ = auVar307._20_4_ + auVar307._4_4_;
              auVar102._8_4_ = auVar307._24_4_ + auVar307._8_4_;
              auVar102._12_4_ = auVar307._28_4_ + auVar307._12_4_;
              auVar121 = vshufpd_avx(auVar102,auVar102,1);
              auVar103._0_4_ = auVar121._0_4_ + auVar102._0_4_;
              auVar103._4_4_ = auVar121._4_4_ + auVar102._4_4_;
              auVar103._8_4_ = auVar121._8_4_ + auVar102._8_4_;
              auVar103._12_4_ = auVar121._12_4_ + auVar102._12_4_;
              auVar121 = vmovshdup_avx(auVar103);
              auVar203 = vshufpd_avx(auVar88,auVar88,1);
              auVar139._0_4_ = auVar203._0_4_ + auVar88._0_4_;
              auVar139._4_4_ = auVar203._4_4_ + auVar88._4_4_;
              auVar139._8_4_ = auVar203._8_4_ + auVar88._8_4_;
              auVar139._12_4_ = auVar203._12_4_ + auVar88._12_4_;
              auVar88 = vmovshdup_avx(auVar139);
              fVar65 = auVar121._0_4_ + fVar65 + auVar103._0_4_ + auVar139._0_4_ + auVar88._0_4_;
              auVar204 = ZEXT464((uint)fVar65);
              if ((int)(uVar33 | 1) < (int)uVar22) {
                pvVar43 = (void *)((long)local_1b0 + lVar29 * uVar30);
                ppp_Var37 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar29 * uVar30);
                do {
                  if (iVar4 < 1) {
                    auVar88 = auVar204._0_16_;
                  }
                  else {
                    lVar34 = 0;
                    iVar56 = iVar4;
                    do {
                      auVar88 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar52),auVar204._0_16_,
                                                ZEXT416(*(uint *)((long)ppp_Var37 + lVar34)));
                      auVar88 = vfmadd231ss_fma(auVar88,ZEXT416(*(uint *)(*pauVar52 + 4)),
                                                ZEXT416(*(uint *)((long)pvVar43 + lVar34)));
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 8);
                      lVar34 = lVar34 + lVar27;
                      auVar204 = ZEXT1664(auVar88);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar207 = ZEXT1664(auVar88);
                  uVar30 = uVar30 + 2;
                  uVar33 = (uint)uVar30;
                  pvVar43 = (void *)((long)pvVar43 + lVar29 * 2);
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar29 * 2);
                  auVar204 = ZEXT1664(auVar88);
                } while ((int)(uVar33 | 1) < (int)uVar22);
              }
              else {
                auVar207 = ZEXT464((uint)fVar65);
              }
              auVar88 = auVar207._0_16_;
              if ((int)uVar33 < (int)uVar22) {
                uVar30 = (ulong)uVar33;
                ppp_Var37 = (_func_int ***)((long)&local_198->_vptr_Allocator + lVar29 * uVar30);
                do {
                  ppp_Var44 = ppp_Var37;
                  iVar56 = iVar4;
                  if (0 < iVar4) {
                    do {
                      auVar88 = vfmadd231ss_fma(auVar207._0_16_,ZEXT416(*(uint *)*pauVar52),
                                                ZEXT416(*(uint *)ppp_Var44));
                      auVar207 = ZEXT1664(auVar88);
                      pauVar52 = (undefined1 (*) [32])(*pauVar52 + 4);
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar27);
                      iVar56 = iVar56 + -1;
                    } while (iVar56 != 0);
                  }
                  auVar88 = auVar207._0_16_;
                  uVar30 = uVar30 + 1;
                  ppp_Var37 = (_func_int ***)((long)ppp_Var37 + lVar29);
                } while ((int)uVar30 < (int)uVar22);
              }
              fVar66 = auVar88._0_4_;
              fVar65 = fVar66;
              switch((int)local_80) {
              case 1:
                auVar88 = vmaxss_avx(auVar88,ZEXT416(0));
                fVar65 = auVar88._0_4_;
                break;
              case 2:
                auVar88 = vcmpss_avx(ZEXT816(0) << 0x40,auVar88,1);
                auVar141._8_4_ = 0x3f800000;
                auVar141._0_8_ = 0x3f8000003f800000;
                auVar141._12_4_ = 0x3f800000;
                auVar88 = vblendvps_avx(ZEXT416((uint)*pfVar62),auVar141,auVar88);
                fVar65 = auVar88._0_4_ * fVar66;
                break;
              case 3:
                auVar88 = vmaxss_avx(auVar88,ZEXT416((uint)*pfVar62));
                fVar65 = auVar88._0_4_;
                if (pfVar62[1] < auVar88._0_4_) {
                  fVar65 = pfVar62[1];
                }
                break;
              case 4:
                auVar88 = vminss_avx(auVar88,ZEXT416(0x42b0c0a5));
                auVar104._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar104._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar104._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar88 = vcmpss_avx(auVar88,ZEXT416(0xc2b0c0a5),1);
                auVar140._8_4_ = 0x42b0c0a5;
                auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                auVar140._12_4_ = 0x42b0c0a5;
                auVar88 = vblendvps_avx(auVar104,auVar140,auVar88);
                fVar65 = expf(auVar88._0_4_);
                fVar65 = 1.0 / (fVar65 + 1.0);
                break;
              case 5:
                fVar65 = expf(fVar66);
                fVar65 = logf(fVar65 + 1.0);
                fVar65 = tanhf(fVar65);
                fVar65 = fVar65 * fVar66;
                break;
              case 6:
                fVar193 = *pfVar62;
                fVar120 = -pfVar62[1] / fVar193;
                fVar65 = 0.0;
                if ((fVar120 <= fVar66) && (fVar65 = fVar66, fVar66 <= fVar120 + 1.0 / fVar193)) {
                  auVar88 = vfmadd213ss_fma(ZEXT416((uint)fVar193),auVar88,ZEXT416((uint)pfVar62[1])
                                           );
                  fVar65 = auVar88._0_4_ * fVar66;
                }
              }
              *pfVar55 = fVar65;
              pfVar55 = pfVar55 + 1;
              lVar34 = local_118._0_8_ + 1;
              iVar25 = iVar25 + iVar45 * iVar3;
              local_1b0 = (void *)((long)local_1b0 + lVar28 * 4);
              local_198 = (Allocator *)((long)&local_198->_vptr_Allocator + lVar28 * 4);
              local_118._0_8_ = lVar34;
            } while (lVar34 != local_60);
          }
          local_1a0 = local_1a0 + 1;
        } while (local_1a0 != local_88);
      }
      iVar45 = 0;
    }
  }
  piVar19 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int Convolution1D_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}